

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx2_blend_popcnt_unroll16(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  ulong uVar499;
  byte bVar500;
  byte bVar501;
  byte bVar502;
  byte bVar503;
  byte bVar504;
  byte bVar505;
  byte bVar506;
  byte bVar507;
  byte bVar508;
  byte bVar509;
  byte bVar510;
  byte bVar511;
  byte bVar512;
  byte bVar513;
  byte bVar514;
  byte bVar515;
  long lVar516;
  ulong uVar517;
  undefined1 auVar518 [32];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [32];
  undefined1 auVar522 [32];
  undefined1 auVar523 [32];
  undefined1 auVar524 [32];
  undefined1 auVar525 [32];
  undefined1 auVar526 [32];
  undefined1 auVar527 [32];
  undefined1 auVar528 [32];
  undefined1 auVar529 [32];
  undefined1 auVar530 [32];
  undefined1 auVar531 [32];
  undefined1 auVar532 [32];
  undefined1 auVar533 [32];
  undefined1 auVar534 [32];
  undefined1 auVar535 [32];
  undefined1 auVar536 [32];
  
  auVar518 = vmovdqa64_avx512vl(_DAT_001162c0);
  auVar519 = vmovdqa64_avx512vl(_DAT_001162e0);
  uVar499 = (ulong)(len >> 4);
  uVar517 = 0;
  while (uVar1 = uVar517 + 0x10, uVar1 <= uVar499) {
    auVar520 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xa0));
    auVar521 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xc0));
    auVar522 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xe0));
    lVar516 = 0x20;
    auVar523 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10));
    auVar524 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10));
    auVar525 = vmovdqa64_avx512vl(auVar521);
    auVar526 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x20),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x30));
    auVar527 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x30),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x20));
    auVar528 = vmovdqa64_avx512vl(auVar522);
    auVar529 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x40),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x50));
    auVar530 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x50),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x40));
    auVar531 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x60),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x70));
    auVar532 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x70),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x60));
    auVar533 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x80),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x90));
    auVar534 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x90),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x80));
    auVar535 = vmovdqa64_avx512vl(auVar520);
    auVar535 = vpermt2b_avx512vl(auVar535,auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xb0));
    auVar536 = vpermt2b_avx512vl(auVar525,auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xd0));
    auVar528 = vpermt2b_avx512vl(auVar528,auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xf0));
    auVar525 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xb0),auVar519,
                                 auVar520);
    auVar520 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xd0),auVar519,
                                 auVar521);
    auVar521 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0xf0),auVar519,
                                 auVar522);
    for (; uVar517 = uVar1, lVar516 != 0; lVar516 = lVar516 + -4) {
      auVar522 = auVar526 >> 7;
      auVar19 = auVar526 >> 0xf;
      auVar35 = auVar526 >> 0x17;
      auVar51 = auVar526 >> 0x1f;
      auVar67 = auVar526 >> 0x27;
      auVar83 = auVar526 >> 0x2f;
      auVar99 = auVar526 >> 0x37;
      auVar115 = auVar526 >> 0x3f;
      auVar131 = auVar526 >> 0x47;
      auVar147 = auVar526 >> 0x4f;
      auVar163 = auVar526 >> 0x57;
      auVar179 = auVar526 >> 0x5f;
      auVar195 = auVar526 >> 0x67;
      auVar211 = auVar526 >> 0x6f;
      auVar227 = auVar526 >> 0x77;
      auVar243 = auVar526 >> 0x7f;
      auVar259 = auVar526 >> 0x87;
      auVar275 = auVar526 >> 0x8f;
      auVar291 = auVar526 >> 0x97;
      auVar307 = auVar526 >> 0x9f;
      auVar323 = auVar526 >> 0xa7;
      auVar339 = auVar526 >> 0xaf;
      auVar355 = auVar526 >> 0xb7;
      auVar371 = auVar526 >> 0xbf;
      auVar387 = auVar526 >> 199;
      auVar403 = auVar526 >> 0xcf;
      auVar419 = auVar526 >> 0xd7;
      auVar435 = auVar526 >> 0xdf;
      auVar451 = auVar526 >> 0xe7;
      auVar467 = auVar526 >> 0xef;
      auVar483 = auVar526 >> 0xf7;
      bVar500 = auVar526[0x1f];
      auVar4 = auVar529 >> 7;
      auVar20 = auVar529 >> 0xf;
      auVar36 = auVar529 >> 0x17;
      auVar52 = auVar529 >> 0x1f;
      auVar68 = auVar529 >> 0x27;
      auVar84 = auVar529 >> 0x2f;
      auVar100 = auVar529 >> 0x37;
      auVar116 = auVar529 >> 0x3f;
      auVar132 = auVar529 >> 0x47;
      auVar148 = auVar529 >> 0x4f;
      auVar164 = auVar529 >> 0x57;
      auVar180 = auVar529 >> 0x5f;
      auVar196 = auVar529 >> 0x67;
      auVar212 = auVar529 >> 0x6f;
      auVar228 = auVar529 >> 0x77;
      auVar244 = auVar529 >> 0x7f;
      auVar260 = auVar529 >> 0x87;
      auVar276 = auVar529 >> 0x8f;
      auVar292 = auVar529 >> 0x97;
      auVar308 = auVar529 >> 0x9f;
      auVar324 = auVar529 >> 0xa7;
      auVar340 = auVar529 >> 0xaf;
      auVar356 = auVar529 >> 0xb7;
      auVar372 = auVar529 >> 0xbf;
      auVar388 = auVar529 >> 199;
      auVar404 = auVar529 >> 0xcf;
      auVar420 = auVar529 >> 0xd7;
      auVar436 = auVar529 >> 0xdf;
      auVar452 = auVar529 >> 0xe7;
      auVar468 = auVar529 >> 0xef;
      auVar484 = auVar529 >> 0xf7;
      bVar501 = auVar529[0x1f];
      auVar5 = auVar527 >> 7;
      auVar21 = auVar527 >> 0xf;
      auVar37 = auVar527 >> 0x17;
      auVar53 = auVar527 >> 0x1f;
      auVar69 = auVar527 >> 0x27;
      auVar85 = auVar527 >> 0x2f;
      auVar101 = auVar527 >> 0x37;
      auVar117 = auVar527 >> 0x3f;
      auVar133 = auVar527 >> 0x47;
      auVar149 = auVar527 >> 0x4f;
      auVar165 = auVar527 >> 0x57;
      auVar181 = auVar527 >> 0x5f;
      auVar197 = auVar527 >> 0x67;
      auVar213 = auVar527 >> 0x6f;
      auVar229 = auVar527 >> 0x77;
      auVar245 = auVar527 >> 0x7f;
      auVar261 = auVar527 >> 0x87;
      auVar277 = auVar527 >> 0x8f;
      auVar293 = auVar527 >> 0x97;
      auVar309 = auVar527 >> 0x9f;
      auVar325 = auVar527 >> 0xa7;
      auVar341 = auVar527 >> 0xaf;
      auVar357 = auVar527 >> 0xb7;
      auVar373 = auVar527 >> 0xbf;
      auVar389 = auVar527 >> 199;
      auVar405 = auVar527 >> 0xcf;
      auVar421 = auVar527 >> 0xd7;
      auVar437 = auVar527 >> 0xdf;
      auVar453 = auVar527 >> 0xe7;
      auVar469 = auVar527 >> 0xef;
      auVar485 = auVar527 >> 0xf7;
      bVar502 = auVar527[0x1f];
      auVar6 = auVar523 >> 7;
      auVar22 = auVar523 >> 0xf;
      auVar38 = auVar523 >> 0x17;
      auVar54 = auVar523 >> 0x1f;
      auVar70 = auVar523 >> 0x27;
      auVar86 = auVar523 >> 0x2f;
      auVar102 = auVar523 >> 0x37;
      auVar118 = auVar523 >> 0x3f;
      auVar134 = auVar523 >> 0x47;
      auVar150 = auVar523 >> 0x4f;
      auVar166 = auVar523 >> 0x57;
      auVar182 = auVar523 >> 0x5f;
      auVar198 = auVar523 >> 0x67;
      auVar214 = auVar523 >> 0x6f;
      auVar230 = auVar523 >> 0x77;
      auVar246 = auVar523 >> 0x7f;
      auVar262 = auVar523 >> 0x87;
      auVar278 = auVar523 >> 0x8f;
      auVar294 = auVar523 >> 0x97;
      auVar310 = auVar523 >> 0x9f;
      auVar326 = auVar523 >> 0xa7;
      auVar342 = auVar523 >> 0xaf;
      auVar358 = auVar523 >> 0xb7;
      auVar374 = auVar523 >> 0xbf;
      auVar390 = auVar523 >> 199;
      auVar406 = auVar523 >> 0xcf;
      auVar422 = auVar523 >> 0xd7;
      auVar438 = auVar523 >> 0xdf;
      auVar454 = auVar523 >> 0xe7;
      auVar470 = auVar523 >> 0xef;
      auVar486 = auVar523 >> 0xf7;
      bVar503 = auVar523[0x1f];
      auVar523 = vpaddb_avx2(auVar523,auVar523);
      auVar526 = vpaddb_avx2(auVar526,auVar526);
      auVar527 = vpaddb_avx2(auVar527,auVar527);
      auVar529 = vpaddb_avx2(auVar529,auVar529);
      auVar7 = auVar524 >> 7;
      auVar23 = auVar524 >> 0xf;
      auVar39 = auVar524 >> 0x17;
      auVar55 = auVar524 >> 0x1f;
      auVar71 = auVar524 >> 0x27;
      auVar87 = auVar524 >> 0x2f;
      auVar103 = auVar524 >> 0x37;
      auVar119 = auVar524 >> 0x3f;
      auVar135 = auVar524 >> 0x47;
      auVar151 = auVar524 >> 0x4f;
      auVar167 = auVar524 >> 0x57;
      auVar183 = auVar524 >> 0x5f;
      auVar199 = auVar524 >> 0x67;
      auVar215 = auVar524 >> 0x6f;
      auVar231 = auVar524 >> 0x77;
      auVar247 = auVar524 >> 0x7f;
      auVar263 = auVar524 >> 0x87;
      auVar279 = auVar524 >> 0x8f;
      auVar295 = auVar524 >> 0x97;
      auVar311 = auVar524 >> 0x9f;
      auVar327 = auVar524 >> 0xa7;
      auVar343 = auVar524 >> 0xaf;
      auVar359 = auVar524 >> 0xb7;
      auVar375 = auVar524 >> 0xbf;
      auVar391 = auVar524 >> 199;
      auVar407 = auVar524 >> 0xcf;
      auVar423 = auVar524 >> 0xd7;
      auVar439 = auVar524 >> 0xdf;
      auVar455 = auVar524 >> 0xe7;
      auVar471 = auVar524 >> 0xef;
      auVar487 = auVar524 >> 0xf7;
      bVar504 = auVar524[0x1f];
      auVar524 = vpaddb_avx2(auVar524,auVar524);
      auVar8 = auVar530 >> 7;
      auVar24 = auVar530 >> 0xf;
      auVar40 = auVar530 >> 0x17;
      auVar56 = auVar530 >> 0x1f;
      auVar72 = auVar530 >> 0x27;
      auVar88 = auVar530 >> 0x2f;
      auVar104 = auVar530 >> 0x37;
      auVar120 = auVar530 >> 0x3f;
      auVar136 = auVar530 >> 0x47;
      auVar152 = auVar530 >> 0x4f;
      auVar168 = auVar530 >> 0x57;
      auVar184 = auVar530 >> 0x5f;
      auVar200 = auVar530 >> 0x67;
      auVar216 = auVar530 >> 0x6f;
      auVar232 = auVar530 >> 0x77;
      auVar248 = auVar530 >> 0x7f;
      auVar264 = auVar530 >> 0x87;
      auVar280 = auVar530 >> 0x8f;
      auVar296 = auVar530 >> 0x97;
      auVar312 = auVar530 >> 0x9f;
      auVar328 = auVar530 >> 0xa7;
      auVar344 = auVar530 >> 0xaf;
      auVar360 = auVar530 >> 0xb7;
      auVar376 = auVar530 >> 0xbf;
      auVar392 = auVar530 >> 199;
      auVar408 = auVar530 >> 0xcf;
      auVar424 = auVar530 >> 0xd7;
      auVar440 = auVar530 >> 0xdf;
      auVar456 = auVar530 >> 0xe7;
      auVar472 = auVar530 >> 0xef;
      auVar488 = auVar530 >> 0xf7;
      bVar505 = auVar530[0x1f];
      auVar530 = vpaddb_avx2(auVar530,auVar530);
      auVar9 = auVar531 >> 7;
      auVar25 = auVar531 >> 0xf;
      auVar41 = auVar531 >> 0x17;
      auVar57 = auVar531 >> 0x1f;
      auVar73 = auVar531 >> 0x27;
      auVar89 = auVar531 >> 0x2f;
      auVar105 = auVar531 >> 0x37;
      auVar121 = auVar531 >> 0x3f;
      auVar137 = auVar531 >> 0x47;
      auVar153 = auVar531 >> 0x4f;
      auVar169 = auVar531 >> 0x57;
      auVar185 = auVar531 >> 0x5f;
      auVar201 = auVar531 >> 0x67;
      auVar217 = auVar531 >> 0x6f;
      auVar233 = auVar531 >> 0x77;
      auVar249 = auVar531 >> 0x7f;
      auVar265 = auVar531 >> 0x87;
      auVar281 = auVar531 >> 0x8f;
      auVar297 = auVar531 >> 0x97;
      auVar313 = auVar531 >> 0x9f;
      auVar329 = auVar531 >> 0xa7;
      auVar345 = auVar531 >> 0xaf;
      auVar361 = auVar531 >> 0xb7;
      auVar377 = auVar531 >> 0xbf;
      auVar393 = auVar531 >> 199;
      auVar409 = auVar531 >> 0xcf;
      auVar425 = auVar531 >> 0xd7;
      auVar441 = auVar531 >> 0xdf;
      auVar457 = auVar531 >> 0xe7;
      auVar473 = auVar531 >> 0xef;
      auVar489 = auVar531 >> 0xf7;
      bVar506 = auVar531[0x1f];
      auVar531 = vpaddb_avx2(auVar531,auVar531);
      auVar10 = auVar532 >> 7;
      auVar26 = auVar532 >> 0xf;
      auVar42 = auVar532 >> 0x17;
      auVar58 = auVar532 >> 0x1f;
      auVar74 = auVar532 >> 0x27;
      auVar90 = auVar532 >> 0x2f;
      auVar106 = auVar532 >> 0x37;
      auVar122 = auVar532 >> 0x3f;
      auVar138 = auVar532 >> 0x47;
      auVar154 = auVar532 >> 0x4f;
      auVar170 = auVar532 >> 0x57;
      auVar186 = auVar532 >> 0x5f;
      auVar202 = auVar532 >> 0x67;
      auVar218 = auVar532 >> 0x6f;
      auVar234 = auVar532 >> 0x77;
      auVar250 = auVar532 >> 0x7f;
      auVar266 = auVar532 >> 0x87;
      auVar282 = auVar532 >> 0x8f;
      auVar298 = auVar532 >> 0x97;
      auVar314 = auVar532 >> 0x9f;
      auVar330 = auVar532 >> 0xa7;
      auVar346 = auVar532 >> 0xaf;
      auVar362 = auVar532 >> 0xb7;
      auVar378 = auVar532 >> 0xbf;
      auVar394 = auVar532 >> 199;
      auVar410 = auVar532 >> 0xcf;
      auVar426 = auVar532 >> 0xd7;
      auVar442 = auVar532 >> 0xdf;
      auVar458 = auVar532 >> 0xe7;
      auVar474 = auVar532 >> 0xef;
      auVar490 = auVar532 >> 0xf7;
      bVar507 = auVar532[0x1f];
      auVar532 = vpaddb_avx2(auVar532,auVar532);
      auVar11 = auVar533 >> 7;
      auVar27 = auVar533 >> 0xf;
      auVar43 = auVar533 >> 0x17;
      auVar59 = auVar533 >> 0x1f;
      auVar75 = auVar533 >> 0x27;
      auVar91 = auVar533 >> 0x2f;
      auVar107 = auVar533 >> 0x37;
      auVar123 = auVar533 >> 0x3f;
      auVar139 = auVar533 >> 0x47;
      auVar155 = auVar533 >> 0x4f;
      auVar171 = auVar533 >> 0x57;
      auVar187 = auVar533 >> 0x5f;
      auVar203 = auVar533 >> 0x67;
      auVar219 = auVar533 >> 0x6f;
      auVar235 = auVar533 >> 0x77;
      auVar251 = auVar533 >> 0x7f;
      auVar267 = auVar533 >> 0x87;
      auVar283 = auVar533 >> 0x8f;
      auVar299 = auVar533 >> 0x97;
      auVar315 = auVar533 >> 0x9f;
      auVar331 = auVar533 >> 0xa7;
      auVar347 = auVar533 >> 0xaf;
      auVar363 = auVar533 >> 0xb7;
      auVar379 = auVar533 >> 0xbf;
      auVar395 = auVar533 >> 199;
      auVar411 = auVar533 >> 0xcf;
      auVar427 = auVar533 >> 0xd7;
      auVar443 = auVar533 >> 0xdf;
      auVar459 = auVar533 >> 0xe7;
      auVar475 = auVar533 >> 0xef;
      auVar491 = auVar533 >> 0xf7;
      bVar508 = auVar533[0x1f];
      auVar533 = vpaddb_avx2(auVar533,auVar533);
      auVar12 = auVar534 >> 7;
      auVar28 = auVar534 >> 0xf;
      auVar44 = auVar534 >> 0x17;
      auVar60 = auVar534 >> 0x1f;
      auVar76 = auVar534 >> 0x27;
      auVar92 = auVar534 >> 0x2f;
      auVar108 = auVar534 >> 0x37;
      auVar124 = auVar534 >> 0x3f;
      auVar140 = auVar534 >> 0x47;
      auVar156 = auVar534 >> 0x4f;
      auVar172 = auVar534 >> 0x57;
      auVar188 = auVar534 >> 0x5f;
      auVar204 = auVar534 >> 0x67;
      auVar220 = auVar534 >> 0x6f;
      auVar236 = auVar534 >> 0x77;
      auVar252 = auVar534 >> 0x7f;
      auVar268 = auVar534 >> 0x87;
      auVar284 = auVar534 >> 0x8f;
      auVar300 = auVar534 >> 0x97;
      auVar316 = auVar534 >> 0x9f;
      auVar332 = auVar534 >> 0xa7;
      auVar348 = auVar534 >> 0xaf;
      auVar364 = auVar534 >> 0xb7;
      auVar380 = auVar534 >> 0xbf;
      auVar396 = auVar534 >> 199;
      auVar412 = auVar534 >> 0xcf;
      auVar428 = auVar534 >> 0xd7;
      auVar444 = auVar534 >> 0xdf;
      auVar460 = auVar534 >> 0xe7;
      auVar476 = auVar534 >> 0xef;
      auVar492 = auVar534 >> 0xf7;
      bVar509 = auVar534[0x1f];
      auVar534 = vpaddb_avx2(auVar534,auVar534);
      auVar13 = auVar535 >> 7;
      auVar29 = auVar535 >> 0xf;
      auVar45 = auVar535 >> 0x17;
      auVar61 = auVar535 >> 0x1f;
      auVar77 = auVar535 >> 0x27;
      auVar93 = auVar535 >> 0x2f;
      auVar109 = auVar535 >> 0x37;
      auVar125 = auVar535 >> 0x3f;
      auVar141 = auVar535 >> 0x47;
      auVar157 = auVar535 >> 0x4f;
      auVar173 = auVar535 >> 0x57;
      auVar189 = auVar535 >> 0x5f;
      auVar205 = auVar535 >> 0x67;
      auVar221 = auVar535 >> 0x6f;
      auVar237 = auVar535 >> 0x77;
      auVar253 = auVar535 >> 0x7f;
      auVar269 = auVar535 >> 0x87;
      auVar285 = auVar535 >> 0x8f;
      auVar301 = auVar535 >> 0x97;
      auVar317 = auVar535 >> 0x9f;
      auVar333 = auVar535 >> 0xa7;
      auVar349 = auVar535 >> 0xaf;
      auVar365 = auVar535 >> 0xb7;
      auVar381 = auVar535 >> 0xbf;
      auVar397 = auVar535 >> 199;
      auVar413 = auVar535 >> 0xcf;
      auVar429 = auVar535 >> 0xd7;
      auVar445 = auVar535 >> 0xdf;
      auVar461 = auVar535 >> 0xe7;
      auVar477 = auVar535 >> 0xef;
      auVar493 = auVar535 >> 0xf7;
      bVar510 = auVar535[0x1f];
      auVar535 = vpaddb_avx2(auVar535,auVar535);
      auVar14 = auVar520 >> 7;
      auVar30 = auVar520 >> 0xf;
      auVar46 = auVar520 >> 0x17;
      auVar62 = auVar520 >> 0x1f;
      auVar78 = auVar520 >> 0x27;
      auVar94 = auVar520 >> 0x2f;
      auVar110 = auVar520 >> 0x37;
      auVar126 = auVar520 >> 0x3f;
      auVar142 = auVar520 >> 0x47;
      auVar158 = auVar520 >> 0x4f;
      auVar174 = auVar520 >> 0x57;
      auVar190 = auVar520 >> 0x5f;
      auVar206 = auVar520 >> 0x67;
      auVar222 = auVar520 >> 0x6f;
      auVar238 = auVar520 >> 0x77;
      auVar254 = auVar520 >> 0x7f;
      auVar270 = auVar520 >> 0x87;
      auVar286 = auVar520 >> 0x8f;
      auVar302 = auVar520 >> 0x97;
      auVar318 = auVar520 >> 0x9f;
      auVar334 = auVar520 >> 0xa7;
      auVar350 = auVar520 >> 0xaf;
      auVar366 = auVar520 >> 0xb7;
      auVar382 = auVar520 >> 0xbf;
      auVar398 = auVar520 >> 199;
      auVar414 = auVar520 >> 0xcf;
      auVar430 = auVar520 >> 0xd7;
      auVar446 = auVar520 >> 0xdf;
      auVar462 = auVar520 >> 0xe7;
      auVar478 = auVar520 >> 0xef;
      auVar494 = auVar520 >> 0xf7;
      bVar511 = auVar520[0x1f];
      auVar520 = vpaddb_avx2(auVar520,auVar520);
      auVar15 = auVar525 >> 7;
      auVar31 = auVar525 >> 0xf;
      auVar47 = auVar525 >> 0x17;
      auVar63 = auVar525 >> 0x1f;
      auVar79 = auVar525 >> 0x27;
      auVar95 = auVar525 >> 0x2f;
      auVar111 = auVar525 >> 0x37;
      auVar127 = auVar525 >> 0x3f;
      auVar143 = auVar525 >> 0x47;
      auVar159 = auVar525 >> 0x4f;
      auVar175 = auVar525 >> 0x57;
      auVar191 = auVar525 >> 0x5f;
      auVar207 = auVar525 >> 0x67;
      auVar223 = auVar525 >> 0x6f;
      auVar239 = auVar525 >> 0x77;
      auVar255 = auVar525 >> 0x7f;
      auVar271 = auVar525 >> 0x87;
      auVar287 = auVar525 >> 0x8f;
      auVar303 = auVar525 >> 0x97;
      auVar319 = auVar525 >> 0x9f;
      auVar335 = auVar525 >> 0xa7;
      auVar351 = auVar525 >> 0xaf;
      auVar367 = auVar525 >> 0xb7;
      auVar383 = auVar525 >> 0xbf;
      auVar399 = auVar525 >> 199;
      auVar415 = auVar525 >> 0xcf;
      auVar431 = auVar525 >> 0xd7;
      auVar447 = auVar525 >> 0xdf;
      auVar463 = auVar525 >> 0xe7;
      auVar479 = auVar525 >> 0xef;
      auVar495 = auVar525 >> 0xf7;
      bVar512 = auVar525[0x1f];
      auVar525 = vpaddb_avx2(auVar525,auVar525);
      auVar16 = auVar528 >> 7;
      auVar32 = auVar528 >> 0xf;
      auVar48 = auVar528 >> 0x17;
      auVar64 = auVar528 >> 0x1f;
      auVar80 = auVar528 >> 0x27;
      auVar96 = auVar528 >> 0x2f;
      auVar112 = auVar528 >> 0x37;
      auVar128 = auVar528 >> 0x3f;
      auVar144 = auVar528 >> 0x47;
      auVar160 = auVar528 >> 0x4f;
      auVar176 = auVar528 >> 0x57;
      auVar192 = auVar528 >> 0x5f;
      auVar208 = auVar528 >> 0x67;
      auVar224 = auVar528 >> 0x6f;
      auVar240 = auVar528 >> 0x77;
      auVar256 = auVar528 >> 0x7f;
      auVar272 = auVar528 >> 0x87;
      auVar288 = auVar528 >> 0x8f;
      auVar304 = auVar528 >> 0x97;
      auVar320 = auVar528 >> 0x9f;
      auVar336 = auVar528 >> 0xa7;
      auVar352 = auVar528 >> 0xaf;
      auVar368 = auVar528 >> 0xb7;
      auVar384 = auVar528 >> 0xbf;
      auVar400 = auVar528 >> 199;
      auVar416 = auVar528 >> 0xcf;
      auVar432 = auVar528 >> 0xd7;
      auVar448 = auVar528 >> 0xdf;
      auVar464 = auVar528 >> 0xe7;
      auVar480 = auVar528 >> 0xef;
      auVar496 = auVar528 >> 0xf7;
      bVar513 = auVar528[0x1f];
      auVar528 = vpaddb_avx2(auVar528,auVar528);
      auVar17 = auVar536 >> 7;
      auVar33 = auVar536 >> 0xf;
      auVar49 = auVar536 >> 0x17;
      auVar65 = auVar536 >> 0x1f;
      auVar81 = auVar536 >> 0x27;
      auVar97 = auVar536 >> 0x2f;
      auVar113 = auVar536 >> 0x37;
      auVar129 = auVar536 >> 0x3f;
      auVar145 = auVar536 >> 0x47;
      auVar161 = auVar536 >> 0x4f;
      auVar177 = auVar536 >> 0x57;
      auVar193 = auVar536 >> 0x5f;
      auVar209 = auVar536 >> 0x67;
      auVar225 = auVar536 >> 0x6f;
      auVar241 = auVar536 >> 0x77;
      auVar257 = auVar536 >> 0x7f;
      auVar273 = auVar536 >> 0x87;
      auVar289 = auVar536 >> 0x8f;
      auVar305 = auVar536 >> 0x97;
      auVar321 = auVar536 >> 0x9f;
      auVar337 = auVar536 >> 0xa7;
      auVar353 = auVar536 >> 0xaf;
      auVar369 = auVar536 >> 0xb7;
      auVar385 = auVar536 >> 0xbf;
      auVar401 = auVar536 >> 199;
      auVar417 = auVar536 >> 0xcf;
      auVar433 = auVar536 >> 0xd7;
      auVar449 = auVar536 >> 0xdf;
      auVar465 = auVar536 >> 0xe7;
      auVar481 = auVar536 >> 0xef;
      auVar497 = auVar536 >> 0xf7;
      bVar514 = auVar536[0x1f];
      auVar536 = vpaddb_avx2(auVar536,auVar536);
      auVar18 = auVar521 >> 7;
      auVar34 = auVar521 >> 0xf;
      auVar50 = auVar521 >> 0x17;
      auVar66 = auVar521 >> 0x1f;
      auVar82 = auVar521 >> 0x27;
      auVar98 = auVar521 >> 0x2f;
      auVar114 = auVar521 >> 0x37;
      auVar130 = auVar521 >> 0x3f;
      auVar146 = auVar521 >> 0x47;
      auVar162 = auVar521 >> 0x4f;
      auVar178 = auVar521 >> 0x57;
      auVar194 = auVar521 >> 0x5f;
      auVar210 = auVar521 >> 0x67;
      auVar226 = auVar521 >> 0x6f;
      auVar242 = auVar521 >> 0x77;
      auVar258 = auVar521 >> 0x7f;
      auVar274 = auVar521 >> 0x87;
      auVar290 = auVar521 >> 0x8f;
      auVar306 = auVar521 >> 0x97;
      auVar322 = auVar521 >> 0x9f;
      auVar338 = auVar521 >> 0xa7;
      auVar354 = auVar521 >> 0xaf;
      auVar370 = auVar521 >> 0xb7;
      auVar386 = auVar521 >> 0xbf;
      auVar402 = auVar521 >> 199;
      auVar418 = auVar521 >> 0xcf;
      auVar434 = auVar521 >> 0xd7;
      auVar450 = auVar521 >> 0xdf;
      auVar466 = auVar521 >> 0xe7;
      auVar482 = auVar521 >> 0xef;
      auVar498 = auVar521 >> 0xf7;
      bVar515 = auVar521[0x1f];
      auVar521 = vpaddb_avx2(auVar521,auVar521);
      *(int *)((long)flags + lVar516 + -4) =
           POPCOUNT((uint)(auVar16[0] & 1) | (uint)(auVar32[0] & 1) << 1 |
                    (uint)(auVar48[0] & 1) << 2 | (uint)(auVar64[0] & 1) << 3 |
                    (uint)(auVar80[0] & 1) << 4 | (uint)(auVar96[0] & 1) << 5 |
                    (uint)(auVar112[0] & 1) << 6 | (uint)(auVar128[0] & 1) << 7 |
                    (uint)(auVar144[0] & 1) << 8 | (uint)(auVar160[0] & 1) << 9 |
                    (uint)(auVar176[0] & 1) << 10 | (uint)(auVar192[0] & 1) << 0xb |
                    (uint)(auVar208[0] & 1) << 0xc | (uint)(auVar224[0] & 1) << 0xd |
                    (uint)(auVar240[0] & 1) << 0xe | (uint)auVar256[0] << 0xf |
                    (uint)(auVar272[0] & 1) << 0x10 | (uint)(auVar288[0] & 1) << 0x11 |
                    (uint)(auVar304[0] & 1) << 0x12 | (uint)(auVar320[0] & 1) << 0x13 |
                    (uint)(auVar336[0] & 1) << 0x14 | (uint)(auVar352[0] & 1) << 0x15 |
                    (uint)(auVar368[0] & 1) << 0x16 | (uint)auVar384[0] << 0x17 |
                    (uint)(auVar400[0] & 1) << 0x18 | (uint)(auVar416[0] & 1) << 0x19 |
                    (uint)(auVar432[0] & 1) << 0x1a | (uint)(auVar448[0] & 1) << 0x1b |
                    (uint)(auVar464[0] & 1) << 0x1c | (uint)(auVar480[0] & 1) << 0x1d |
                    (uint)(auVar496[0] & 1) << 0x1e | (uint)(bVar513 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar17[0] & 1) | (uint)(auVar33[0] & 1) << 1 |
                    (uint)(auVar49[0] & 1) << 2 | (uint)(auVar65[0] & 1) << 3 |
                    (uint)(auVar81[0] & 1) << 4 | (uint)(auVar97[0] & 1) << 5 |
                    (uint)(auVar113[0] & 1) << 6 | (uint)(auVar129[0] & 1) << 7 |
                    (uint)(auVar145[0] & 1) << 8 | (uint)(auVar161[0] & 1) << 9 |
                    (uint)(auVar177[0] & 1) << 10 | (uint)(auVar193[0] & 1) << 0xb |
                    (uint)(auVar209[0] & 1) << 0xc | (uint)(auVar225[0] & 1) << 0xd |
                    (uint)(auVar241[0] & 1) << 0xe | (uint)auVar257[0] << 0xf |
                    (uint)(auVar273[0] & 1) << 0x10 | (uint)(auVar289[0] & 1) << 0x11 |
                    (uint)(auVar305[0] & 1) << 0x12 | (uint)(auVar321[0] & 1) << 0x13 |
                    (uint)(auVar337[0] & 1) << 0x14 | (uint)(auVar353[0] & 1) << 0x15 |
                    (uint)(auVar369[0] & 1) << 0x16 | (uint)auVar385[0] << 0x17 |
                    (uint)(auVar401[0] & 1) << 0x18 | (uint)(auVar417[0] & 1) << 0x19 |
                    (uint)(auVar433[0] & 1) << 0x1a | (uint)(auVar449[0] & 1) << 0x1b |
                    (uint)(auVar465[0] & 1) << 0x1c | (uint)(auVar481[0] & 1) << 0x1d |
                    (uint)(auVar497[0] & 1) << 0x1e | (uint)(bVar514 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar13[0] & 1) | (uint)(auVar29[0] & 1) << 1 |
                    (uint)(auVar45[0] & 1) << 2 | (uint)(auVar61[0] & 1) << 3 |
                    (uint)(auVar77[0] & 1) << 4 | (uint)(auVar93[0] & 1) << 5 |
                    (uint)(auVar109[0] & 1) << 6 | (uint)(auVar125[0] & 1) << 7 |
                    (uint)(auVar141[0] & 1) << 8 | (uint)(auVar157[0] & 1) << 9 |
                    (uint)(auVar173[0] & 1) << 10 | (uint)(auVar189[0] & 1) << 0xb |
                    (uint)(auVar205[0] & 1) << 0xc | (uint)(auVar221[0] & 1) << 0xd |
                    (uint)(auVar237[0] & 1) << 0xe | (uint)auVar253[0] << 0xf |
                    (uint)(auVar269[0] & 1) << 0x10 | (uint)(auVar285[0] & 1) << 0x11 |
                    (uint)(auVar301[0] & 1) << 0x12 | (uint)(auVar317[0] & 1) << 0x13 |
                    (uint)(auVar333[0] & 1) << 0x14 | (uint)(auVar349[0] & 1) << 0x15 |
                    (uint)(auVar365[0] & 1) << 0x16 | (uint)auVar381[0] << 0x17 |
                    (uint)(auVar397[0] & 1) << 0x18 | (uint)(auVar413[0] & 1) << 0x19 |
                    (uint)(auVar429[0] & 1) << 0x1a | (uint)(auVar445[0] & 1) << 0x1b |
                    (uint)(auVar461[0] & 1) << 0x1c | (uint)(auVar477[0] & 1) << 0x1d |
                    (uint)(auVar493[0] & 1) << 0x1e | (uint)(bVar510 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar11[0] & 1) | (uint)(auVar27[0] & 1) << 1 |
                    (uint)(auVar43[0] & 1) << 2 | (uint)(auVar59[0] & 1) << 3 |
                    (uint)(auVar75[0] & 1) << 4 | (uint)(auVar91[0] & 1) << 5 |
                    (uint)(auVar107[0] & 1) << 6 | (uint)(auVar123[0] & 1) << 7 |
                    (uint)(auVar139[0] & 1) << 8 | (uint)(auVar155[0] & 1) << 9 |
                    (uint)(auVar171[0] & 1) << 10 | (uint)(auVar187[0] & 1) << 0xb |
                    (uint)(auVar203[0] & 1) << 0xc | (uint)(auVar219[0] & 1) << 0xd |
                    (uint)(auVar235[0] & 1) << 0xe | (uint)auVar251[0] << 0xf |
                    (uint)(auVar267[0] & 1) << 0x10 | (uint)(auVar283[0] & 1) << 0x11 |
                    (uint)(auVar299[0] & 1) << 0x12 | (uint)(auVar315[0] & 1) << 0x13 |
                    (uint)(auVar331[0] & 1) << 0x14 | (uint)(auVar347[0] & 1) << 0x15 |
                    (uint)(auVar363[0] & 1) << 0x16 | (uint)auVar379[0] << 0x17 |
                    (uint)(auVar395[0] & 1) << 0x18 | (uint)(auVar411[0] & 1) << 0x19 |
                    (uint)(auVar427[0] & 1) << 0x1a | (uint)(auVar443[0] & 1) << 0x1b |
                    (uint)(auVar459[0] & 1) << 0x1c | (uint)(auVar475[0] & 1) << 0x1d |
                    (uint)(auVar491[0] & 1) << 0x1e | (uint)(bVar508 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar9[0] & 1) | (uint)(auVar25[0] & 1) << 1 |
                    (uint)(auVar41[0] & 1) << 2 | (uint)(auVar57[0] & 1) << 3 |
                    (uint)(auVar73[0] & 1) << 4 | (uint)(auVar89[0] & 1) << 5 |
                    (uint)(auVar105[0] & 1) << 6 | (uint)(auVar121[0] & 1) << 7 |
                    (uint)(auVar137[0] & 1) << 8 | (uint)(auVar153[0] & 1) << 9 |
                    (uint)(auVar169[0] & 1) << 10 | (uint)(auVar185[0] & 1) << 0xb |
                    (uint)(auVar201[0] & 1) << 0xc | (uint)(auVar217[0] & 1) << 0xd |
                    (uint)(auVar233[0] & 1) << 0xe | (uint)auVar249[0] << 0xf |
                    (uint)(auVar265[0] & 1) << 0x10 | (uint)(auVar281[0] & 1) << 0x11 |
                    (uint)(auVar297[0] & 1) << 0x12 | (uint)(auVar313[0] & 1) << 0x13 |
                    (uint)(auVar329[0] & 1) << 0x14 | (uint)(auVar345[0] & 1) << 0x15 |
                    (uint)(auVar361[0] & 1) << 0x16 | (uint)auVar377[0] << 0x17 |
                    (uint)(auVar393[0] & 1) << 0x18 | (uint)(auVar409[0] & 1) << 0x19 |
                    (uint)(auVar425[0] & 1) << 0x1a | (uint)(auVar441[0] & 1) << 0x1b |
                    (uint)(auVar457[0] & 1) << 0x1c | (uint)(auVar473[0] & 1) << 0x1d |
                    (uint)(auVar489[0] & 1) << 0x1e | (uint)(bVar506 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar20[0] & 1) << 1 |
                    (uint)(auVar36[0] & 1) << 2 | (uint)(auVar52[0] & 1) << 3 |
                    (uint)(auVar68[0] & 1) << 4 | (uint)(auVar84[0] & 1) << 5 |
                    (uint)(auVar100[0] & 1) << 6 | (uint)(auVar116[0] & 1) << 7 |
                    (uint)(auVar132[0] & 1) << 8 | (uint)(auVar148[0] & 1) << 9 |
                    (uint)(auVar164[0] & 1) << 10 | (uint)(auVar180[0] & 1) << 0xb |
                    (uint)(auVar196[0] & 1) << 0xc | (uint)(auVar212[0] & 1) << 0xd |
                    (uint)(auVar228[0] & 1) << 0xe | (uint)auVar244[0] << 0xf |
                    (uint)(auVar260[0] & 1) << 0x10 | (uint)(auVar276[0] & 1) << 0x11 |
                    (uint)(auVar292[0] & 1) << 0x12 | (uint)(auVar308[0] & 1) << 0x13 |
                    (uint)(auVar324[0] & 1) << 0x14 | (uint)(auVar340[0] & 1) << 0x15 |
                    (uint)(auVar356[0] & 1) << 0x16 | (uint)auVar372[0] << 0x17 |
                    (uint)(auVar388[0] & 1) << 0x18 | (uint)(auVar404[0] & 1) << 0x19 |
                    (uint)(auVar420[0] & 1) << 0x1a | (uint)(auVar436[0] & 1) << 0x1b |
                    (uint)(auVar452[0] & 1) << 0x1c | (uint)(auVar468[0] & 1) << 0x1d |
                    (uint)(auVar484[0] & 1) << 0x1e | (uint)(bVar501 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar522[0] & 1) | (uint)(auVar19[0] & 1) << 1 |
                    (uint)(auVar35[0] & 1) << 2 | (uint)(auVar51[0] & 1) << 3 |
                    (uint)(auVar67[0] & 1) << 4 | (uint)(auVar83[0] & 1) << 5 |
                    (uint)(auVar99[0] & 1) << 6 | (uint)(auVar115[0] & 1) << 7 |
                    (uint)(auVar131[0] & 1) << 8 | (uint)(auVar147[0] & 1) << 9 |
                    (uint)(auVar163[0] & 1) << 10 | (uint)(auVar179[0] & 1) << 0xb |
                    (uint)(auVar195[0] & 1) << 0xc | (uint)(auVar211[0] & 1) << 0xd |
                    (uint)(auVar227[0] & 1) << 0xe | (uint)auVar243[0] << 0xf |
                    (uint)(auVar259[0] & 1) << 0x10 | (uint)(auVar275[0] & 1) << 0x11 |
                    (uint)(auVar291[0] & 1) << 0x12 | (uint)(auVar307[0] & 1) << 0x13 |
                    (uint)(auVar323[0] & 1) << 0x14 | (uint)(auVar339[0] & 1) << 0x15 |
                    (uint)(auVar355[0] & 1) << 0x16 | (uint)auVar371[0] << 0x17 |
                    (uint)(auVar387[0] & 1) << 0x18 | (uint)(auVar403[0] & 1) << 0x19 |
                    (uint)(auVar419[0] & 1) << 0x1a | (uint)(auVar435[0] & 1) << 0x1b |
                    (uint)(auVar451[0] & 1) << 0x1c | (uint)(auVar467[0] & 1) << 0x1d |
                    (uint)(auVar483[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar6[0] & 1) | (uint)(auVar22[0] & 1) << 1 |
                    (uint)(auVar38[0] & 1) << 2 | (uint)(auVar54[0] & 1) << 3 |
                    (uint)(auVar70[0] & 1) << 4 | (uint)(auVar86[0] & 1) << 5 |
                    (uint)(auVar102[0] & 1) << 6 | (uint)(auVar118[0] & 1) << 7 |
                    (uint)(auVar134[0] & 1) << 8 | (uint)(auVar150[0] & 1) << 9 |
                    (uint)(auVar166[0] & 1) << 10 | (uint)(auVar182[0] & 1) << 0xb |
                    (uint)(auVar198[0] & 1) << 0xc | (uint)(auVar214[0] & 1) << 0xd |
                    (uint)(auVar230[0] & 1) << 0xe | (uint)auVar246[0] << 0xf |
                    (uint)(auVar262[0] & 1) << 0x10 | (uint)(auVar278[0] & 1) << 0x11 |
                    (uint)(auVar294[0] & 1) << 0x12 | (uint)(auVar310[0] & 1) << 0x13 |
                    (uint)(auVar326[0] & 1) << 0x14 | (uint)(auVar342[0] & 1) << 0x15 |
                    (uint)(auVar358[0] & 1) << 0x16 | (uint)auVar374[0] << 0x17 |
                    (uint)(auVar390[0] & 1) << 0x18 | (uint)(auVar406[0] & 1) << 0x19 |
                    (uint)(auVar422[0] & 1) << 0x1a | (uint)(auVar438[0] & 1) << 0x1b |
                    (uint)(auVar454[0] & 1) << 0x1c | (uint)(auVar470[0] & 1) << 0x1d |
                    (uint)(auVar486[0] & 1) << 0x1e | (uint)(bVar503 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar516 + -4);
      *(int *)((long)flags + lVar516 + 0x1c) =
           POPCOUNT((uint)(auVar18[0] & 1) | (uint)(auVar34[0] & 1) << 1 |
                    (uint)(auVar50[0] & 1) << 2 | (uint)(auVar66[0] & 1) << 3 |
                    (uint)(auVar82[0] & 1) << 4 | (uint)(auVar98[0] & 1) << 5 |
                    (uint)(auVar114[0] & 1) << 6 | (uint)(auVar130[0] & 1) << 7 |
                    (uint)(auVar146[0] & 1) << 8 | (uint)(auVar162[0] & 1) << 9 |
                    (uint)(auVar178[0] & 1) << 10 | (uint)(auVar194[0] & 1) << 0xb |
                    (uint)(auVar210[0] & 1) << 0xc | (uint)(auVar226[0] & 1) << 0xd |
                    (uint)(auVar242[0] & 1) << 0xe | (uint)auVar258[0] << 0xf |
                    (uint)(auVar274[0] & 1) << 0x10 | (uint)(auVar290[0] & 1) << 0x11 |
                    (uint)(auVar306[0] & 1) << 0x12 | (uint)(auVar322[0] & 1) << 0x13 |
                    (uint)(auVar338[0] & 1) << 0x14 | (uint)(auVar354[0] & 1) << 0x15 |
                    (uint)(auVar370[0] & 1) << 0x16 | (uint)auVar386[0] << 0x17 |
                    (uint)(auVar402[0] & 1) << 0x18 | (uint)(auVar418[0] & 1) << 0x19 |
                    (uint)(auVar434[0] & 1) << 0x1a | (uint)(auVar450[0] & 1) << 0x1b |
                    (uint)(auVar466[0] & 1) << 0x1c | (uint)(auVar482[0] & 1) << 0x1d |
                    (uint)(auVar498[0] & 1) << 0x1e | (uint)(bVar515 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar14[0] & 1) | (uint)(auVar30[0] & 1) << 1 |
                    (uint)(auVar46[0] & 1) << 2 | (uint)(auVar62[0] & 1) << 3 |
                    (uint)(auVar78[0] & 1) << 4 | (uint)(auVar94[0] & 1) << 5 |
                    (uint)(auVar110[0] & 1) << 6 | (uint)(auVar126[0] & 1) << 7 |
                    (uint)(auVar142[0] & 1) << 8 | (uint)(auVar158[0] & 1) << 9 |
                    (uint)(auVar174[0] & 1) << 10 | (uint)(auVar190[0] & 1) << 0xb |
                    (uint)(auVar206[0] & 1) << 0xc | (uint)(auVar222[0] & 1) << 0xd |
                    (uint)(auVar238[0] & 1) << 0xe | (uint)auVar254[0] << 0xf |
                    (uint)(auVar270[0] & 1) << 0x10 | (uint)(auVar286[0] & 1) << 0x11 |
                    (uint)(auVar302[0] & 1) << 0x12 | (uint)(auVar318[0] & 1) << 0x13 |
                    (uint)(auVar334[0] & 1) << 0x14 | (uint)(auVar350[0] & 1) << 0x15 |
                    (uint)(auVar366[0] & 1) << 0x16 | (uint)auVar382[0] << 0x17 |
                    (uint)(auVar398[0] & 1) << 0x18 | (uint)(auVar414[0] & 1) << 0x19 |
                    (uint)(auVar430[0] & 1) << 0x1a | (uint)(auVar446[0] & 1) << 0x1b |
                    (uint)(auVar462[0] & 1) << 0x1c | (uint)(auVar478[0] & 1) << 0x1d |
                    (uint)(auVar494[0] & 1) << 0x1e | (uint)(bVar511 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar15[0] & 1) | (uint)(auVar31[0] & 1) << 1 |
                    (uint)(auVar47[0] & 1) << 2 | (uint)(auVar63[0] & 1) << 3 |
                    (uint)(auVar79[0] & 1) << 4 | (uint)(auVar95[0] & 1) << 5 |
                    (uint)(auVar111[0] & 1) << 6 | (uint)(auVar127[0] & 1) << 7 |
                    (uint)(auVar143[0] & 1) << 8 | (uint)(auVar159[0] & 1) << 9 |
                    (uint)(auVar175[0] & 1) << 10 | (uint)(auVar191[0] & 1) << 0xb |
                    (uint)(auVar207[0] & 1) << 0xc | (uint)(auVar223[0] & 1) << 0xd |
                    (uint)(auVar239[0] & 1) << 0xe | (uint)auVar255[0] << 0xf |
                    (uint)(auVar271[0] & 1) << 0x10 | (uint)(auVar287[0] & 1) << 0x11 |
                    (uint)(auVar303[0] & 1) << 0x12 | (uint)(auVar319[0] & 1) << 0x13 |
                    (uint)(auVar335[0] & 1) << 0x14 | (uint)(auVar351[0] & 1) << 0x15 |
                    (uint)(auVar367[0] & 1) << 0x16 | (uint)auVar383[0] << 0x17 |
                    (uint)(auVar399[0] & 1) << 0x18 | (uint)(auVar415[0] & 1) << 0x19 |
                    (uint)(auVar431[0] & 1) << 0x1a | (uint)(auVar447[0] & 1) << 0x1b |
                    (uint)(auVar463[0] & 1) << 0x1c | (uint)(auVar479[0] & 1) << 0x1d |
                    (uint)(auVar495[0] & 1) << 0x1e | (uint)(bVar512 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar12[0] & 1) | (uint)(auVar28[0] & 1) << 1 |
                    (uint)(auVar44[0] & 1) << 2 | (uint)(auVar60[0] & 1) << 3 |
                    (uint)(auVar76[0] & 1) << 4 | (uint)(auVar92[0] & 1) << 5 |
                    (uint)(auVar108[0] & 1) << 6 | (uint)(auVar124[0] & 1) << 7 |
                    (uint)(auVar140[0] & 1) << 8 | (uint)(auVar156[0] & 1) << 9 |
                    (uint)(auVar172[0] & 1) << 10 | (uint)(auVar188[0] & 1) << 0xb |
                    (uint)(auVar204[0] & 1) << 0xc | (uint)(auVar220[0] & 1) << 0xd |
                    (uint)(auVar236[0] & 1) << 0xe | (uint)auVar252[0] << 0xf |
                    (uint)(auVar268[0] & 1) << 0x10 | (uint)(auVar284[0] & 1) << 0x11 |
                    (uint)(auVar300[0] & 1) << 0x12 | (uint)(auVar316[0] & 1) << 0x13 |
                    (uint)(auVar332[0] & 1) << 0x14 | (uint)(auVar348[0] & 1) << 0x15 |
                    (uint)(auVar364[0] & 1) << 0x16 | (uint)auVar380[0] << 0x17 |
                    (uint)(auVar396[0] & 1) << 0x18 | (uint)(auVar412[0] & 1) << 0x19 |
                    (uint)(auVar428[0] & 1) << 0x1a | (uint)(auVar444[0] & 1) << 0x1b |
                    (uint)(auVar460[0] & 1) << 0x1c | (uint)(auVar476[0] & 1) << 0x1d |
                    (uint)(auVar492[0] & 1) << 0x1e | (uint)(bVar509 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar10[0] & 1) | (uint)(auVar26[0] & 1) << 1 |
                    (uint)(auVar42[0] & 1) << 2 | (uint)(auVar58[0] & 1) << 3 |
                    (uint)(auVar74[0] & 1) << 4 | (uint)(auVar90[0] & 1) << 5 |
                    (uint)(auVar106[0] & 1) << 6 | (uint)(auVar122[0] & 1) << 7 |
                    (uint)(auVar138[0] & 1) << 8 | (uint)(auVar154[0] & 1) << 9 |
                    (uint)(auVar170[0] & 1) << 10 | (uint)(auVar186[0] & 1) << 0xb |
                    (uint)(auVar202[0] & 1) << 0xc | (uint)(auVar218[0] & 1) << 0xd |
                    (uint)(auVar234[0] & 1) << 0xe | (uint)auVar250[0] << 0xf |
                    (uint)(auVar266[0] & 1) << 0x10 | (uint)(auVar282[0] & 1) << 0x11 |
                    (uint)(auVar298[0] & 1) << 0x12 | (uint)(auVar314[0] & 1) << 0x13 |
                    (uint)(auVar330[0] & 1) << 0x14 | (uint)(auVar346[0] & 1) << 0x15 |
                    (uint)(auVar362[0] & 1) << 0x16 | (uint)auVar378[0] << 0x17 |
                    (uint)(auVar394[0] & 1) << 0x18 | (uint)(auVar410[0] & 1) << 0x19 |
                    (uint)(auVar426[0] & 1) << 0x1a | (uint)(auVar442[0] & 1) << 0x1b |
                    (uint)(auVar458[0] & 1) << 0x1c | (uint)(auVar474[0] & 1) << 0x1d |
                    (uint)(auVar490[0] & 1) << 0x1e | (uint)(bVar507 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar8[0] & 1) | (uint)(auVar24[0] & 1) << 1 |
                    (uint)(auVar40[0] & 1) << 2 | (uint)(auVar56[0] & 1) << 3 |
                    (uint)(auVar72[0] & 1) << 4 | (uint)(auVar88[0] & 1) << 5 |
                    (uint)(auVar104[0] & 1) << 6 | (uint)(auVar120[0] & 1) << 7 |
                    (uint)(auVar136[0] & 1) << 8 | (uint)(auVar152[0] & 1) << 9 |
                    (uint)(auVar168[0] & 1) << 10 | (uint)(auVar184[0] & 1) << 0xb |
                    (uint)(auVar200[0] & 1) << 0xc | (uint)(auVar216[0] & 1) << 0xd |
                    (uint)(auVar232[0] & 1) << 0xe | (uint)auVar248[0] << 0xf |
                    (uint)(auVar264[0] & 1) << 0x10 | (uint)(auVar280[0] & 1) << 0x11 |
                    (uint)(auVar296[0] & 1) << 0x12 | (uint)(auVar312[0] & 1) << 0x13 |
                    (uint)(auVar328[0] & 1) << 0x14 | (uint)(auVar344[0] & 1) << 0x15 |
                    (uint)(auVar360[0] & 1) << 0x16 | (uint)auVar376[0] << 0x17 |
                    (uint)(auVar392[0] & 1) << 0x18 | (uint)(auVar408[0] & 1) << 0x19 |
                    (uint)(auVar424[0] & 1) << 0x1a | (uint)(auVar440[0] & 1) << 0x1b |
                    (uint)(auVar456[0] & 1) << 0x1c | (uint)(auVar472[0] & 1) << 0x1d |
                    (uint)(auVar488[0] & 1) << 0x1e | (uint)(bVar505 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar5[0] & 1) | (uint)(auVar21[0] & 1) << 1 |
                    (uint)(auVar37[0] & 1) << 2 | (uint)(auVar53[0] & 1) << 3 |
                    (uint)(auVar69[0] & 1) << 4 | (uint)(auVar85[0] & 1) << 5 |
                    (uint)(auVar101[0] & 1) << 6 | (uint)(auVar117[0] & 1) << 7 |
                    (uint)(auVar133[0] & 1) << 8 | (uint)(auVar149[0] & 1) << 9 |
                    (uint)(auVar165[0] & 1) << 10 | (uint)(auVar181[0] & 1) << 0xb |
                    (uint)(auVar197[0] & 1) << 0xc | (uint)(auVar213[0] & 1) << 0xd |
                    (uint)(auVar229[0] & 1) << 0xe | (uint)auVar245[0] << 0xf |
                    (uint)(auVar261[0] & 1) << 0x10 | (uint)(auVar277[0] & 1) << 0x11 |
                    (uint)(auVar293[0] & 1) << 0x12 | (uint)(auVar309[0] & 1) << 0x13 |
                    (uint)(auVar325[0] & 1) << 0x14 | (uint)(auVar341[0] & 1) << 0x15 |
                    (uint)(auVar357[0] & 1) << 0x16 | (uint)auVar373[0] << 0x17 |
                    (uint)(auVar389[0] & 1) << 0x18 | (uint)(auVar405[0] & 1) << 0x19 |
                    (uint)(auVar421[0] & 1) << 0x1a | (uint)(auVar437[0] & 1) << 0x1b |
                    (uint)(auVar453[0] & 1) << 0x1c | (uint)(auVar469[0] & 1) << 0x1d |
                    (uint)(auVar485[0] & 1) << 0x1e | (uint)(bVar502 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar7[0] & 1) | (uint)(auVar23[0] & 1) << 1 |
                    (uint)(auVar39[0] & 1) << 2 | (uint)(auVar55[0] & 1) << 3 |
                    (uint)(auVar71[0] & 1) << 4 | (uint)(auVar87[0] & 1) << 5 |
                    (uint)(auVar103[0] & 1) << 6 | (uint)(auVar119[0] & 1) << 7 |
                    (uint)(auVar135[0] & 1) << 8 | (uint)(auVar151[0] & 1) << 9 |
                    (uint)(auVar167[0] & 1) << 10 | (uint)(auVar183[0] & 1) << 0xb |
                    (uint)(auVar199[0] & 1) << 0xc | (uint)(auVar215[0] & 1) << 0xd |
                    (uint)(auVar231[0] & 1) << 0xe | (uint)auVar247[0] << 0xf |
                    (uint)(auVar263[0] & 1) << 0x10 | (uint)(auVar279[0] & 1) << 0x11 |
                    (uint)(auVar295[0] & 1) << 0x12 | (uint)(auVar311[0] & 1) << 0x13 |
                    (uint)(auVar327[0] & 1) << 0x14 | (uint)(auVar343[0] & 1) << 0x15 |
                    (uint)(auVar359[0] & 1) << 0x16 | (uint)auVar375[0] << 0x17 |
                    (uint)(auVar391[0] & 1) << 0x18 | (uint)(auVar407[0] & 1) << 0x19 |
                    (uint)(auVar423[0] & 1) << 0x1a | (uint)(auVar439[0] & 1) << 0x1b |
                    (uint)(auVar455[0] & 1) << 0x1c | (uint)(auVar471[0] & 1) << 0x1d |
                    (uint)(auVar487[0] & 1) << 0x1e | (uint)(bVar504 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar516 + 0x1c);
    }
  }
  while (uVar1 = uVar517 + 8, uVar1 <= uVar499) {
    lVar516 = 0x20;
    auVar523 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10));
    auVar526 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10));
    auVar527 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x20),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x30));
    auVar529 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x30),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x20));
    auVar524 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x40),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x50));
    auVar530 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x50),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x40));
    auVar531 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x60),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x70));
    auVar532 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x70),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x60));
    for (; uVar517 = uVar1, lVar516 != 0; lVar516 = lVar516 + -4) {
      auVar533 = auVar527 >> 7;
      auVar522 = auVar527 >> 0xf;
      auVar11 = auVar527 >> 0x17;
      auVar19 = auVar527 >> 0x1f;
      auVar27 = auVar527 >> 0x27;
      auVar35 = auVar527 >> 0x2f;
      auVar43 = auVar527 >> 0x37;
      auVar51 = auVar527 >> 0x3f;
      auVar59 = auVar527 >> 0x47;
      auVar67 = auVar527 >> 0x4f;
      auVar75 = auVar527 >> 0x57;
      auVar83 = auVar527 >> 0x5f;
      auVar91 = auVar527 >> 0x67;
      auVar99 = auVar527 >> 0x6f;
      auVar107 = auVar527 >> 0x77;
      auVar115 = auVar527 >> 0x7f;
      auVar123 = auVar527 >> 0x87;
      auVar131 = auVar527 >> 0x8f;
      auVar139 = auVar527 >> 0x97;
      auVar147 = auVar527 >> 0x9f;
      auVar155 = auVar527 >> 0xa7;
      auVar163 = auVar527 >> 0xaf;
      auVar171 = auVar527 >> 0xb7;
      auVar179 = auVar527 >> 0xbf;
      auVar187 = auVar527 >> 199;
      auVar195 = auVar527 >> 0xcf;
      auVar203 = auVar527 >> 0xd7;
      auVar211 = auVar527 >> 0xdf;
      auVar219 = auVar527 >> 0xe7;
      auVar227 = auVar527 >> 0xef;
      auVar235 = auVar527 >> 0xf7;
      bVar500 = auVar527[0x1f];
      auVar534 = auVar524 >> 7;
      auVar4 = auVar524 >> 0xf;
      auVar12 = auVar524 >> 0x17;
      auVar20 = auVar524 >> 0x1f;
      auVar28 = auVar524 >> 0x27;
      auVar36 = auVar524 >> 0x2f;
      auVar44 = auVar524 >> 0x37;
      auVar52 = auVar524 >> 0x3f;
      auVar60 = auVar524 >> 0x47;
      auVar68 = auVar524 >> 0x4f;
      auVar76 = auVar524 >> 0x57;
      auVar84 = auVar524 >> 0x5f;
      auVar92 = auVar524 >> 0x67;
      auVar100 = auVar524 >> 0x6f;
      auVar108 = auVar524 >> 0x77;
      auVar116 = auVar524 >> 0x7f;
      auVar124 = auVar524 >> 0x87;
      auVar132 = auVar524 >> 0x8f;
      auVar140 = auVar524 >> 0x97;
      auVar148 = auVar524 >> 0x9f;
      auVar156 = auVar524 >> 0xa7;
      auVar164 = auVar524 >> 0xaf;
      auVar172 = auVar524 >> 0xb7;
      auVar180 = auVar524 >> 0xbf;
      auVar188 = auVar524 >> 199;
      auVar196 = auVar524 >> 0xcf;
      auVar204 = auVar524 >> 0xd7;
      auVar212 = auVar524 >> 0xdf;
      auVar220 = auVar524 >> 0xe7;
      auVar228 = auVar524 >> 0xef;
      auVar236 = auVar524 >> 0xf7;
      bVar501 = auVar524[0x1f];
      auVar535 = auVar523 >> 7;
      auVar5 = auVar523 >> 0xf;
      auVar13 = auVar523 >> 0x17;
      auVar21 = auVar523 >> 0x1f;
      auVar29 = auVar523 >> 0x27;
      auVar37 = auVar523 >> 0x2f;
      auVar45 = auVar523 >> 0x37;
      auVar53 = auVar523 >> 0x3f;
      auVar61 = auVar523 >> 0x47;
      auVar69 = auVar523 >> 0x4f;
      auVar77 = auVar523 >> 0x57;
      auVar85 = auVar523 >> 0x5f;
      auVar93 = auVar523 >> 0x67;
      auVar101 = auVar523 >> 0x6f;
      auVar109 = auVar523 >> 0x77;
      auVar117 = auVar523 >> 0x7f;
      auVar125 = auVar523 >> 0x87;
      auVar133 = auVar523 >> 0x8f;
      auVar141 = auVar523 >> 0x97;
      auVar149 = auVar523 >> 0x9f;
      auVar157 = auVar523 >> 0xa7;
      auVar165 = auVar523 >> 0xaf;
      auVar173 = auVar523 >> 0xb7;
      auVar181 = auVar523 >> 0xbf;
      auVar189 = auVar523 >> 199;
      auVar197 = auVar523 >> 0xcf;
      auVar205 = auVar523 >> 0xd7;
      auVar213 = auVar523 >> 0xdf;
      auVar221 = auVar523 >> 0xe7;
      auVar229 = auVar523 >> 0xef;
      auVar237 = auVar523 >> 0xf7;
      bVar502 = auVar523[0x1f];
      auVar520 = auVar529 >> 7;
      auVar6 = auVar529 >> 0xf;
      auVar14 = auVar529 >> 0x17;
      auVar22 = auVar529 >> 0x1f;
      auVar30 = auVar529 >> 0x27;
      auVar38 = auVar529 >> 0x2f;
      auVar46 = auVar529 >> 0x37;
      auVar54 = auVar529 >> 0x3f;
      auVar62 = auVar529 >> 0x47;
      auVar70 = auVar529 >> 0x4f;
      auVar78 = auVar529 >> 0x57;
      auVar86 = auVar529 >> 0x5f;
      auVar94 = auVar529 >> 0x67;
      auVar102 = auVar529 >> 0x6f;
      auVar110 = auVar529 >> 0x77;
      auVar118 = auVar529 >> 0x7f;
      auVar126 = auVar529 >> 0x87;
      auVar134 = auVar529 >> 0x8f;
      auVar142 = auVar529 >> 0x97;
      auVar150 = auVar529 >> 0x9f;
      auVar158 = auVar529 >> 0xa7;
      auVar166 = auVar529 >> 0xaf;
      auVar174 = auVar529 >> 0xb7;
      auVar182 = auVar529 >> 0xbf;
      auVar190 = auVar529 >> 199;
      auVar198 = auVar529 >> 0xcf;
      auVar206 = auVar529 >> 0xd7;
      auVar214 = auVar529 >> 0xdf;
      auVar222 = auVar529 >> 0xe7;
      auVar230 = auVar529 >> 0xef;
      auVar238 = auVar529 >> 0xf7;
      bVar503 = auVar529[0x1f];
      auVar525 = auVar526 >> 7;
      auVar7 = auVar526 >> 0xf;
      auVar15 = auVar526 >> 0x17;
      auVar23 = auVar526 >> 0x1f;
      auVar31 = auVar526 >> 0x27;
      auVar39 = auVar526 >> 0x2f;
      auVar47 = auVar526 >> 0x37;
      auVar55 = auVar526 >> 0x3f;
      auVar63 = auVar526 >> 0x47;
      auVar71 = auVar526 >> 0x4f;
      auVar79 = auVar526 >> 0x57;
      auVar87 = auVar526 >> 0x5f;
      auVar95 = auVar526 >> 0x67;
      auVar103 = auVar526 >> 0x6f;
      auVar111 = auVar526 >> 0x77;
      auVar119 = auVar526 >> 0x7f;
      auVar127 = auVar526 >> 0x87;
      auVar135 = auVar526 >> 0x8f;
      auVar143 = auVar526 >> 0x97;
      auVar151 = auVar526 >> 0x9f;
      auVar159 = auVar526 >> 0xa7;
      auVar167 = auVar526 >> 0xaf;
      auVar175 = auVar526 >> 0xb7;
      auVar183 = auVar526 >> 0xbf;
      auVar191 = auVar526 >> 199;
      auVar199 = auVar526 >> 0xcf;
      auVar207 = auVar526 >> 0xd7;
      auVar215 = auVar526 >> 0xdf;
      auVar223 = auVar526 >> 0xe7;
      auVar231 = auVar526 >> 0xef;
      auVar239 = auVar526 >> 0xf7;
      bVar504 = auVar526[0x1f];
      auVar523 = vpaddb_avx2(auVar523,auVar523);
      auVar526 = vpaddb_avx2(auVar526,auVar526);
      auVar527 = vpaddb_avx2(auVar527,auVar527);
      auVar529 = vpaddb_avx2(auVar529,auVar529);
      auVar524 = vpaddb_avx2(auVar524,auVar524);
      auVar528 = auVar530 >> 7;
      auVar8 = auVar530 >> 0xf;
      auVar16 = auVar530 >> 0x17;
      auVar24 = auVar530 >> 0x1f;
      auVar32 = auVar530 >> 0x27;
      auVar40 = auVar530 >> 0x2f;
      auVar48 = auVar530 >> 0x37;
      auVar56 = auVar530 >> 0x3f;
      auVar64 = auVar530 >> 0x47;
      auVar72 = auVar530 >> 0x4f;
      auVar80 = auVar530 >> 0x57;
      auVar88 = auVar530 >> 0x5f;
      auVar96 = auVar530 >> 0x67;
      auVar104 = auVar530 >> 0x6f;
      auVar112 = auVar530 >> 0x77;
      auVar120 = auVar530 >> 0x7f;
      auVar128 = auVar530 >> 0x87;
      auVar136 = auVar530 >> 0x8f;
      auVar144 = auVar530 >> 0x97;
      auVar152 = auVar530 >> 0x9f;
      auVar160 = auVar530 >> 0xa7;
      auVar168 = auVar530 >> 0xaf;
      auVar176 = auVar530 >> 0xb7;
      auVar184 = auVar530 >> 0xbf;
      auVar192 = auVar530 >> 199;
      auVar200 = auVar530 >> 0xcf;
      auVar208 = auVar530 >> 0xd7;
      auVar216 = auVar530 >> 0xdf;
      auVar224 = auVar530 >> 0xe7;
      auVar232 = auVar530 >> 0xef;
      auVar240 = auVar530 >> 0xf7;
      bVar505 = auVar530[0x1f];
      auVar530 = vpaddb_avx2(auVar530,auVar530);
      auVar536 = auVar531 >> 7;
      auVar9 = auVar531 >> 0xf;
      auVar17 = auVar531 >> 0x17;
      auVar25 = auVar531 >> 0x1f;
      auVar33 = auVar531 >> 0x27;
      auVar41 = auVar531 >> 0x2f;
      auVar49 = auVar531 >> 0x37;
      auVar57 = auVar531 >> 0x3f;
      auVar65 = auVar531 >> 0x47;
      auVar73 = auVar531 >> 0x4f;
      auVar81 = auVar531 >> 0x57;
      auVar89 = auVar531 >> 0x5f;
      auVar97 = auVar531 >> 0x67;
      auVar105 = auVar531 >> 0x6f;
      auVar113 = auVar531 >> 0x77;
      auVar121 = auVar531 >> 0x7f;
      auVar129 = auVar531 >> 0x87;
      auVar137 = auVar531 >> 0x8f;
      auVar145 = auVar531 >> 0x97;
      auVar153 = auVar531 >> 0x9f;
      auVar161 = auVar531 >> 0xa7;
      auVar169 = auVar531 >> 0xaf;
      auVar177 = auVar531 >> 0xb7;
      auVar185 = auVar531 >> 0xbf;
      auVar193 = auVar531 >> 199;
      auVar201 = auVar531 >> 0xcf;
      auVar209 = auVar531 >> 0xd7;
      auVar217 = auVar531 >> 0xdf;
      auVar225 = auVar531 >> 0xe7;
      auVar233 = auVar531 >> 0xef;
      auVar241 = auVar531 >> 0xf7;
      bVar506 = auVar531[0x1f];
      auVar531 = vpaddb_avx2(auVar531,auVar531);
      auVar521 = auVar532 >> 7;
      auVar10 = auVar532 >> 0xf;
      auVar18 = auVar532 >> 0x17;
      auVar26 = auVar532 >> 0x1f;
      auVar34 = auVar532 >> 0x27;
      auVar42 = auVar532 >> 0x2f;
      auVar50 = auVar532 >> 0x37;
      auVar58 = auVar532 >> 0x3f;
      auVar66 = auVar532 >> 0x47;
      auVar74 = auVar532 >> 0x4f;
      auVar82 = auVar532 >> 0x57;
      auVar90 = auVar532 >> 0x5f;
      auVar98 = auVar532 >> 0x67;
      auVar106 = auVar532 >> 0x6f;
      auVar114 = auVar532 >> 0x77;
      auVar122 = auVar532 >> 0x7f;
      auVar130 = auVar532 >> 0x87;
      auVar138 = auVar532 >> 0x8f;
      auVar146 = auVar532 >> 0x97;
      auVar154 = auVar532 >> 0x9f;
      auVar162 = auVar532 >> 0xa7;
      auVar170 = auVar532 >> 0xaf;
      auVar178 = auVar532 >> 0xb7;
      auVar186 = auVar532 >> 0xbf;
      auVar194 = auVar532 >> 199;
      auVar202 = auVar532 >> 0xcf;
      auVar210 = auVar532 >> 0xd7;
      auVar218 = auVar532 >> 0xdf;
      auVar226 = auVar532 >> 0xe7;
      auVar234 = auVar532 >> 0xef;
      auVar242 = auVar532 >> 0xf7;
      bVar507 = auVar532[0x1f];
      auVar532 = vpaddb_avx2(auVar532,auVar532);
      *(int *)((long)flags + lVar516 + -4) =
           POPCOUNT((uint)(auVar536[0] & 1) | (uint)(auVar9[0] & 1) << 1 |
                    (uint)(auVar17[0] & 1) << 2 | (uint)(auVar25[0] & 1) << 3 |
                    (uint)(auVar33[0] & 1) << 4 | (uint)(auVar41[0] & 1) << 5 |
                    (uint)(auVar49[0] & 1) << 6 | (uint)(auVar57[0] & 1) << 7 |
                    (uint)(auVar65[0] & 1) << 8 | (uint)(auVar73[0] & 1) << 9 |
                    (uint)(auVar81[0] & 1) << 10 | (uint)(auVar89[0] & 1) << 0xb |
                    (uint)(auVar97[0] & 1) << 0xc | (uint)(auVar105[0] & 1) << 0xd |
                    (uint)(auVar113[0] & 1) << 0xe | (uint)auVar121[0] << 0xf |
                    (uint)(auVar129[0] & 1) << 0x10 | (uint)(auVar137[0] & 1) << 0x11 |
                    (uint)(auVar145[0] & 1) << 0x12 | (uint)(auVar153[0] & 1) << 0x13 |
                    (uint)(auVar161[0] & 1) << 0x14 | (uint)(auVar169[0] & 1) << 0x15 |
                    (uint)(auVar177[0] & 1) << 0x16 | (uint)auVar185[0] << 0x17 |
                    (uint)(auVar193[0] & 1) << 0x18 | (uint)(auVar201[0] & 1) << 0x19 |
                    (uint)(auVar209[0] & 1) << 0x1a | (uint)(auVar217[0] & 1) << 0x1b |
                    (uint)(auVar225[0] & 1) << 0x1c | (uint)(auVar233[0] & 1) << 0x1d |
                    (uint)(auVar241[0] & 1) << 0x1e | (uint)(bVar506 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar534[0] & 1) | (uint)(auVar4[0] & 1) << 1 |
                    (uint)(auVar12[0] & 1) << 2 | (uint)(auVar20[0] & 1) << 3 |
                    (uint)(auVar28[0] & 1) << 4 | (uint)(auVar36[0] & 1) << 5 |
                    (uint)(auVar44[0] & 1) << 6 | (uint)(auVar52[0] & 1) << 7 |
                    (uint)(auVar60[0] & 1) << 8 | (uint)(auVar68[0] & 1) << 9 |
                    (uint)(auVar76[0] & 1) << 10 | (uint)(auVar84[0] & 1) << 0xb |
                    (uint)(auVar92[0] & 1) << 0xc | (uint)(auVar100[0] & 1) << 0xd |
                    (uint)(auVar108[0] & 1) << 0xe | (uint)auVar116[0] << 0xf |
                    (uint)(auVar124[0] & 1) << 0x10 | (uint)(auVar132[0] & 1) << 0x11 |
                    (uint)(auVar140[0] & 1) << 0x12 | (uint)(auVar148[0] & 1) << 0x13 |
                    (uint)(auVar156[0] & 1) << 0x14 | (uint)(auVar164[0] & 1) << 0x15 |
                    (uint)(auVar172[0] & 1) << 0x16 | (uint)auVar180[0] << 0x17 |
                    (uint)(auVar188[0] & 1) << 0x18 | (uint)(auVar196[0] & 1) << 0x19 |
                    (uint)(auVar204[0] & 1) << 0x1a | (uint)(auVar212[0] & 1) << 0x1b |
                    (uint)(auVar220[0] & 1) << 0x1c | (uint)(auVar228[0] & 1) << 0x1d |
                    (uint)(auVar236[0] & 1) << 0x1e | (uint)(bVar501 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar533[0] & 1) | (uint)(auVar522[0] & 1) << 1 |
                    (uint)(auVar11[0] & 1) << 2 | (uint)(auVar19[0] & 1) << 3 |
                    (uint)(auVar27[0] & 1) << 4 | (uint)(auVar35[0] & 1) << 5 |
                    (uint)(auVar43[0] & 1) << 6 | (uint)(auVar51[0] & 1) << 7 |
                    (uint)(auVar59[0] & 1) << 8 | (uint)(auVar67[0] & 1) << 9 |
                    (uint)(auVar75[0] & 1) << 10 | (uint)(auVar83[0] & 1) << 0xb |
                    (uint)(auVar91[0] & 1) << 0xc | (uint)(auVar99[0] & 1) << 0xd |
                    (uint)(auVar107[0] & 1) << 0xe | (uint)auVar115[0] << 0xf |
                    (uint)(auVar123[0] & 1) << 0x10 | (uint)(auVar131[0] & 1) << 0x11 |
                    (uint)(auVar139[0] & 1) << 0x12 | (uint)(auVar147[0] & 1) << 0x13 |
                    (uint)(auVar155[0] & 1) << 0x14 | (uint)(auVar163[0] & 1) << 0x15 |
                    (uint)(auVar171[0] & 1) << 0x16 | (uint)auVar179[0] << 0x17 |
                    (uint)(auVar187[0] & 1) << 0x18 | (uint)(auVar195[0] & 1) << 0x19 |
                    (uint)(auVar203[0] & 1) << 0x1a | (uint)(auVar211[0] & 1) << 0x1b |
                    (uint)(auVar219[0] & 1) << 0x1c | (uint)(auVar227[0] & 1) << 0x1d |
                    (uint)(auVar235[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar535[0] & 1) | (uint)(auVar5[0] & 1) << 1 |
                    (uint)(auVar13[0] & 1) << 2 | (uint)(auVar21[0] & 1) << 3 |
                    (uint)(auVar29[0] & 1) << 4 | (uint)(auVar37[0] & 1) << 5 |
                    (uint)(auVar45[0] & 1) << 6 | (uint)(auVar53[0] & 1) << 7 |
                    (uint)(auVar61[0] & 1) << 8 | (uint)(auVar69[0] & 1) << 9 |
                    (uint)(auVar77[0] & 1) << 10 | (uint)(auVar85[0] & 1) << 0xb |
                    (uint)(auVar93[0] & 1) << 0xc | (uint)(auVar101[0] & 1) << 0xd |
                    (uint)(auVar109[0] & 1) << 0xe | (uint)auVar117[0] << 0xf |
                    (uint)(auVar125[0] & 1) << 0x10 | (uint)(auVar133[0] & 1) << 0x11 |
                    (uint)(auVar141[0] & 1) << 0x12 | (uint)(auVar149[0] & 1) << 0x13 |
                    (uint)(auVar157[0] & 1) << 0x14 | (uint)(auVar165[0] & 1) << 0x15 |
                    (uint)(auVar173[0] & 1) << 0x16 | (uint)auVar181[0] << 0x17 |
                    (uint)(auVar189[0] & 1) << 0x18 | (uint)(auVar197[0] & 1) << 0x19 |
                    (uint)(auVar205[0] & 1) << 0x1a | (uint)(auVar213[0] & 1) << 0x1b |
                    (uint)(auVar221[0] & 1) << 0x1c | (uint)(auVar229[0] & 1) << 0x1d |
                    (uint)(auVar237[0] & 1) << 0x1e | (uint)(bVar502 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar516 + -4);
      *(int *)((long)flags + lVar516 + 0x1c) =
           POPCOUNT((uint)(auVar521[0] & 1) | (uint)(auVar10[0] & 1) << 1 |
                    (uint)(auVar18[0] & 1) << 2 | (uint)(auVar26[0] & 1) << 3 |
                    (uint)(auVar34[0] & 1) << 4 | (uint)(auVar42[0] & 1) << 5 |
                    (uint)(auVar50[0] & 1) << 6 | (uint)(auVar58[0] & 1) << 7 |
                    (uint)(auVar66[0] & 1) << 8 | (uint)(auVar74[0] & 1) << 9 |
                    (uint)(auVar82[0] & 1) << 10 | (uint)(auVar90[0] & 1) << 0xb |
                    (uint)(auVar98[0] & 1) << 0xc | (uint)(auVar106[0] & 1) << 0xd |
                    (uint)(auVar114[0] & 1) << 0xe | (uint)auVar122[0] << 0xf |
                    (uint)(auVar130[0] & 1) << 0x10 | (uint)(auVar138[0] & 1) << 0x11 |
                    (uint)(auVar146[0] & 1) << 0x12 | (uint)(auVar154[0] & 1) << 0x13 |
                    (uint)(auVar162[0] & 1) << 0x14 | (uint)(auVar170[0] & 1) << 0x15 |
                    (uint)(auVar178[0] & 1) << 0x16 | (uint)auVar186[0] << 0x17 |
                    (uint)(auVar194[0] & 1) << 0x18 | (uint)(auVar202[0] & 1) << 0x19 |
                    (uint)(auVar210[0] & 1) << 0x1a | (uint)(auVar218[0] & 1) << 0x1b |
                    (uint)(auVar226[0] & 1) << 0x1c | (uint)(auVar234[0] & 1) << 0x1d |
                    (uint)(auVar242[0] & 1) << 0x1e | (uint)(bVar507 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar528[0] & 1) | (uint)(auVar8[0] & 1) << 1 |
                    (uint)(auVar16[0] & 1) << 2 | (uint)(auVar24[0] & 1) << 3 |
                    (uint)(auVar32[0] & 1) << 4 | (uint)(auVar40[0] & 1) << 5 |
                    (uint)(auVar48[0] & 1) << 6 | (uint)(auVar56[0] & 1) << 7 |
                    (uint)(auVar64[0] & 1) << 8 | (uint)(auVar72[0] & 1) << 9 |
                    (uint)(auVar80[0] & 1) << 10 | (uint)(auVar88[0] & 1) << 0xb |
                    (uint)(auVar96[0] & 1) << 0xc | (uint)(auVar104[0] & 1) << 0xd |
                    (uint)(auVar112[0] & 1) << 0xe | (uint)auVar120[0] << 0xf |
                    (uint)(auVar128[0] & 1) << 0x10 | (uint)(auVar136[0] & 1) << 0x11 |
                    (uint)(auVar144[0] & 1) << 0x12 | (uint)(auVar152[0] & 1) << 0x13 |
                    (uint)(auVar160[0] & 1) << 0x14 | (uint)(auVar168[0] & 1) << 0x15 |
                    (uint)(auVar176[0] & 1) << 0x16 | (uint)auVar184[0] << 0x17 |
                    (uint)(auVar192[0] & 1) << 0x18 | (uint)(auVar200[0] & 1) << 0x19 |
                    (uint)(auVar208[0] & 1) << 0x1a | (uint)(auVar216[0] & 1) << 0x1b |
                    (uint)(auVar224[0] & 1) << 0x1c | (uint)(auVar232[0] & 1) << 0x1d |
                    (uint)(auVar240[0] & 1) << 0x1e | (uint)(bVar505 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar520[0] & 1) | (uint)(auVar6[0] & 1) << 1 |
                    (uint)(auVar14[0] & 1) << 2 | (uint)(auVar22[0] & 1) << 3 |
                    (uint)(auVar30[0] & 1) << 4 | (uint)(auVar38[0] & 1) << 5 |
                    (uint)(auVar46[0] & 1) << 6 | (uint)(auVar54[0] & 1) << 7 |
                    (uint)(auVar62[0] & 1) << 8 | (uint)(auVar70[0] & 1) << 9 |
                    (uint)(auVar78[0] & 1) << 10 | (uint)(auVar86[0] & 1) << 0xb |
                    (uint)(auVar94[0] & 1) << 0xc | (uint)(auVar102[0] & 1) << 0xd |
                    (uint)(auVar110[0] & 1) << 0xe | (uint)auVar118[0] << 0xf |
                    (uint)(auVar126[0] & 1) << 0x10 | (uint)(auVar134[0] & 1) << 0x11 |
                    (uint)(auVar142[0] & 1) << 0x12 | (uint)(auVar150[0] & 1) << 0x13 |
                    (uint)(auVar158[0] & 1) << 0x14 | (uint)(auVar166[0] & 1) << 0x15 |
                    (uint)(auVar174[0] & 1) << 0x16 | (uint)auVar182[0] << 0x17 |
                    (uint)(auVar190[0] & 1) << 0x18 | (uint)(auVar198[0] & 1) << 0x19 |
                    (uint)(auVar206[0] & 1) << 0x1a | (uint)(auVar214[0] & 1) << 0x1b |
                    (uint)(auVar222[0] & 1) << 0x1c | (uint)(auVar230[0] & 1) << 0x1d |
                    (uint)(auVar238[0] & 1) << 0x1e | (uint)(bVar503 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar525[0] & 1) | (uint)(auVar7[0] & 1) << 1 |
                    (uint)(auVar15[0] & 1) << 2 | (uint)(auVar23[0] & 1) << 3 |
                    (uint)(auVar31[0] & 1) << 4 | (uint)(auVar39[0] & 1) << 5 |
                    (uint)(auVar47[0] & 1) << 6 | (uint)(auVar55[0] & 1) << 7 |
                    (uint)(auVar63[0] & 1) << 8 | (uint)(auVar71[0] & 1) << 9 |
                    (uint)(auVar79[0] & 1) << 10 | (uint)(auVar87[0] & 1) << 0xb |
                    (uint)(auVar95[0] & 1) << 0xc | (uint)(auVar103[0] & 1) << 0xd |
                    (uint)(auVar111[0] & 1) << 0xe | (uint)auVar119[0] << 0xf |
                    (uint)(auVar127[0] & 1) << 0x10 | (uint)(auVar135[0] & 1) << 0x11 |
                    (uint)(auVar143[0] & 1) << 0x12 | (uint)(auVar151[0] & 1) << 0x13 |
                    (uint)(auVar159[0] & 1) << 0x14 | (uint)(auVar167[0] & 1) << 0x15 |
                    (uint)(auVar175[0] & 1) << 0x16 | (uint)auVar183[0] << 0x17 |
                    (uint)(auVar191[0] & 1) << 0x18 | (uint)(auVar199[0] & 1) << 0x19 |
                    (uint)(auVar207[0] & 1) << 0x1a | (uint)(auVar215[0] & 1) << 0x1b |
                    (uint)(auVar223[0] & 1) << 0x1c | (uint)(auVar231[0] & 1) << 0x1d |
                    (uint)(auVar239[0] & 1) << 0x1e | (uint)(bVar504 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar516 + 0x1c);
    }
  }
  while (uVar1 = uVar517 + 4, uVar1 <= uVar499) {
    lVar516 = 0x20;
    auVar523 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10));
    auVar526 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10));
    auVar527 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x20),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x30));
    auVar529 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x30),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x20));
    for (; uVar517 = uVar1, lVar516 != 0; lVar516 = lVar516 + -4) {
      auVar524 = auVar523 >> 7;
      auVar533 = auVar523 >> 0xf;
      auVar525 = auVar523 >> 0x17;
      auVar522 = auVar523 >> 0x1f;
      auVar7 = auVar523 >> 0x27;
      auVar11 = auVar523 >> 0x2f;
      auVar15 = auVar523 >> 0x37;
      auVar19 = auVar523 >> 0x3f;
      auVar23 = auVar523 >> 0x47;
      auVar27 = auVar523 >> 0x4f;
      auVar31 = auVar523 >> 0x57;
      auVar35 = auVar523 >> 0x5f;
      auVar39 = auVar523 >> 0x67;
      auVar43 = auVar523 >> 0x6f;
      auVar47 = auVar523 >> 0x77;
      auVar51 = auVar523 >> 0x7f;
      auVar55 = auVar523 >> 0x87;
      auVar59 = auVar523 >> 0x8f;
      auVar63 = auVar523 >> 0x97;
      auVar67 = auVar523 >> 0x9f;
      auVar71 = auVar523 >> 0xa7;
      auVar75 = auVar523 >> 0xaf;
      auVar79 = auVar523 >> 0xb7;
      auVar83 = auVar523 >> 0xbf;
      auVar87 = auVar523 >> 199;
      auVar91 = auVar523 >> 0xcf;
      auVar95 = auVar523 >> 0xd7;
      auVar99 = auVar523 >> 0xdf;
      auVar103 = auVar523 >> 0xe7;
      auVar107 = auVar523 >> 0xef;
      auVar111 = auVar523 >> 0xf7;
      bVar500 = auVar523[0x1f];
      auVar530 = auVar526 >> 7;
      auVar534 = auVar526 >> 0xf;
      auVar528 = auVar526 >> 0x17;
      auVar4 = auVar526 >> 0x1f;
      auVar8 = auVar526 >> 0x27;
      auVar12 = auVar526 >> 0x2f;
      auVar16 = auVar526 >> 0x37;
      auVar20 = auVar526 >> 0x3f;
      auVar24 = auVar526 >> 0x47;
      auVar28 = auVar526 >> 0x4f;
      auVar32 = auVar526 >> 0x57;
      auVar36 = auVar526 >> 0x5f;
      auVar40 = auVar526 >> 0x67;
      auVar44 = auVar526 >> 0x6f;
      auVar48 = auVar526 >> 0x77;
      auVar52 = auVar526 >> 0x7f;
      auVar56 = auVar526 >> 0x87;
      auVar60 = auVar526 >> 0x8f;
      auVar64 = auVar526 >> 0x97;
      auVar68 = auVar526 >> 0x9f;
      auVar72 = auVar526 >> 0xa7;
      auVar76 = auVar526 >> 0xaf;
      auVar80 = auVar526 >> 0xb7;
      auVar84 = auVar526 >> 0xbf;
      auVar88 = auVar526 >> 199;
      auVar92 = auVar526 >> 0xcf;
      auVar96 = auVar526 >> 0xd7;
      auVar100 = auVar526 >> 0xdf;
      auVar104 = auVar526 >> 0xe7;
      auVar108 = auVar526 >> 0xef;
      auVar112 = auVar526 >> 0xf7;
      bVar501 = auVar526[0x1f];
      auVar531 = auVar527 >> 7;
      auVar535 = auVar527 >> 0xf;
      auVar536 = auVar527 >> 0x17;
      auVar5 = auVar527 >> 0x1f;
      auVar9 = auVar527 >> 0x27;
      auVar13 = auVar527 >> 0x2f;
      auVar17 = auVar527 >> 0x37;
      auVar21 = auVar527 >> 0x3f;
      auVar25 = auVar527 >> 0x47;
      auVar29 = auVar527 >> 0x4f;
      auVar33 = auVar527 >> 0x57;
      auVar37 = auVar527 >> 0x5f;
      auVar41 = auVar527 >> 0x67;
      auVar45 = auVar527 >> 0x6f;
      auVar49 = auVar527 >> 0x77;
      auVar53 = auVar527 >> 0x7f;
      auVar57 = auVar527 >> 0x87;
      auVar61 = auVar527 >> 0x8f;
      auVar65 = auVar527 >> 0x97;
      auVar69 = auVar527 >> 0x9f;
      auVar73 = auVar527 >> 0xa7;
      auVar77 = auVar527 >> 0xaf;
      auVar81 = auVar527 >> 0xb7;
      auVar85 = auVar527 >> 0xbf;
      auVar89 = auVar527 >> 199;
      auVar93 = auVar527 >> 0xcf;
      auVar97 = auVar527 >> 0xd7;
      auVar101 = auVar527 >> 0xdf;
      auVar105 = auVar527 >> 0xe7;
      auVar109 = auVar527 >> 0xef;
      auVar113 = auVar527 >> 0xf7;
      bVar502 = auVar527[0x1f];
      auVar523 = vpaddb_avx2(auVar523,auVar523);
      auVar526 = vpaddb_avx2(auVar526,auVar526);
      auVar527 = vpaddb_avx2(auVar527,auVar527);
      auVar532 = auVar529 >> 7;
      auVar520 = auVar529 >> 0xf;
      auVar521 = auVar529 >> 0x17;
      auVar6 = auVar529 >> 0x1f;
      auVar10 = auVar529 >> 0x27;
      auVar14 = auVar529 >> 0x2f;
      auVar18 = auVar529 >> 0x37;
      auVar22 = auVar529 >> 0x3f;
      auVar26 = auVar529 >> 0x47;
      auVar30 = auVar529 >> 0x4f;
      auVar34 = auVar529 >> 0x57;
      auVar38 = auVar529 >> 0x5f;
      auVar42 = auVar529 >> 0x67;
      auVar46 = auVar529 >> 0x6f;
      auVar50 = auVar529 >> 0x77;
      auVar54 = auVar529 >> 0x7f;
      auVar58 = auVar529 >> 0x87;
      auVar62 = auVar529 >> 0x8f;
      auVar66 = auVar529 >> 0x97;
      auVar70 = auVar529 >> 0x9f;
      auVar74 = auVar529 >> 0xa7;
      auVar78 = auVar529 >> 0xaf;
      auVar82 = auVar529 >> 0xb7;
      auVar86 = auVar529 >> 0xbf;
      auVar90 = auVar529 >> 199;
      auVar94 = auVar529 >> 0xcf;
      auVar98 = auVar529 >> 0xd7;
      auVar102 = auVar529 >> 0xdf;
      auVar106 = auVar529 >> 0xe7;
      auVar110 = auVar529 >> 0xef;
      auVar114 = auVar529 >> 0xf7;
      bVar503 = auVar529[0x1f];
      auVar529 = vpaddb_avx2(auVar529,auVar529);
      *(int *)((long)flags + lVar516 + -4) =
           POPCOUNT((uint)(auVar531[0] & 1) | (uint)(auVar535[0] & 1) << 1 |
                    (uint)(auVar536[0] & 1) << 2 | (uint)(auVar5[0] & 1) << 3 |
                    (uint)(auVar9[0] & 1) << 4 | (uint)(auVar13[0] & 1) << 5 |
                    (uint)(auVar17[0] & 1) << 6 | (uint)(auVar21[0] & 1) << 7 |
                    (uint)(auVar25[0] & 1) << 8 | (uint)(auVar29[0] & 1) << 9 |
                    (uint)(auVar33[0] & 1) << 10 | (uint)(auVar37[0] & 1) << 0xb |
                    (uint)(auVar41[0] & 1) << 0xc | (uint)(auVar45[0] & 1) << 0xd |
                    (uint)(auVar49[0] & 1) << 0xe | (uint)auVar53[0] << 0xf |
                    (uint)(auVar57[0] & 1) << 0x10 | (uint)(auVar61[0] & 1) << 0x11 |
                    (uint)(auVar65[0] & 1) << 0x12 | (uint)(auVar69[0] & 1) << 0x13 |
                    (uint)(auVar73[0] & 1) << 0x14 | (uint)(auVar77[0] & 1) << 0x15 |
                    (uint)(auVar81[0] & 1) << 0x16 | (uint)auVar85[0] << 0x17 |
                    (uint)(auVar89[0] & 1) << 0x18 | (uint)(auVar93[0] & 1) << 0x19 |
                    (uint)(auVar97[0] & 1) << 0x1a | (uint)(auVar101[0] & 1) << 0x1b |
                    (uint)(auVar105[0] & 1) << 0x1c | (uint)(auVar109[0] & 1) << 0x1d |
                    (uint)(auVar113[0] & 1) << 0x1e | (uint)(bVar502 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar524[0] & 1) | (uint)(auVar533[0] & 1) << 1 |
                    (uint)(auVar525[0] & 1) << 2 | (uint)(auVar522[0] & 1) << 3 |
                    (uint)(auVar7[0] & 1) << 4 | (uint)(auVar11[0] & 1) << 5 |
                    (uint)(auVar15[0] & 1) << 6 | (uint)(auVar19[0] & 1) << 7 |
                    (uint)(auVar23[0] & 1) << 8 | (uint)(auVar27[0] & 1) << 9 |
                    (uint)(auVar31[0] & 1) << 10 | (uint)(auVar35[0] & 1) << 0xb |
                    (uint)(auVar39[0] & 1) << 0xc | (uint)(auVar43[0] & 1) << 0xd |
                    (uint)(auVar47[0] & 1) << 0xe | (uint)auVar51[0] << 0xf |
                    (uint)(auVar55[0] & 1) << 0x10 | (uint)(auVar59[0] & 1) << 0x11 |
                    (uint)(auVar63[0] & 1) << 0x12 | (uint)(auVar67[0] & 1) << 0x13 |
                    (uint)(auVar71[0] & 1) << 0x14 | (uint)(auVar75[0] & 1) << 0x15 |
                    (uint)(auVar79[0] & 1) << 0x16 | (uint)auVar83[0] << 0x17 |
                    (uint)(auVar87[0] & 1) << 0x18 | (uint)(auVar91[0] & 1) << 0x19 |
                    (uint)(auVar95[0] & 1) << 0x1a | (uint)(auVar99[0] & 1) << 0x1b |
                    (uint)(auVar103[0] & 1) << 0x1c | (uint)(auVar107[0] & 1) << 0x1d |
                    (uint)(auVar111[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar516 + -4);
      *(int *)((long)flags + lVar516 + 0x1c) =
           POPCOUNT((uint)(auVar532[0] & 1) | (uint)(auVar520[0] & 1) << 1 |
                    (uint)(auVar521[0] & 1) << 2 | (uint)(auVar6[0] & 1) << 3 |
                    (uint)(auVar10[0] & 1) << 4 | (uint)(auVar14[0] & 1) << 5 |
                    (uint)(auVar18[0] & 1) << 6 | (uint)(auVar22[0] & 1) << 7 |
                    (uint)(auVar26[0] & 1) << 8 | (uint)(auVar30[0] & 1) << 9 |
                    (uint)(auVar34[0] & 1) << 10 | (uint)(auVar38[0] & 1) << 0xb |
                    (uint)(auVar42[0] & 1) << 0xc | (uint)(auVar46[0] & 1) << 0xd |
                    (uint)(auVar50[0] & 1) << 0xe | (uint)auVar54[0] << 0xf |
                    (uint)(auVar58[0] & 1) << 0x10 | (uint)(auVar62[0] & 1) << 0x11 |
                    (uint)(auVar66[0] & 1) << 0x12 | (uint)(auVar70[0] & 1) << 0x13 |
                    (uint)(auVar74[0] & 1) << 0x14 | (uint)(auVar78[0] & 1) << 0x15 |
                    (uint)(auVar82[0] & 1) << 0x16 | (uint)auVar86[0] << 0x17 |
                    (uint)(auVar90[0] & 1) << 0x18 | (uint)(auVar94[0] & 1) << 0x19 |
                    (uint)(auVar98[0] & 1) << 0x1a | (uint)(auVar102[0] & 1) << 0x1b |
                    (uint)(auVar106[0] & 1) << 0x1c | (uint)(auVar110[0] & 1) << 0x1d |
                    (uint)(auVar114[0] & 1) << 0x1e | (uint)(bVar503 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar530[0] & 1) | (uint)(auVar534[0] & 1) << 1 |
                    (uint)(auVar528[0] & 1) << 2 | (uint)(auVar4[0] & 1) << 3 |
                    (uint)(auVar8[0] & 1) << 4 | (uint)(auVar12[0] & 1) << 5 |
                    (uint)(auVar16[0] & 1) << 6 | (uint)(auVar20[0] & 1) << 7 |
                    (uint)(auVar24[0] & 1) << 8 | (uint)(auVar28[0] & 1) << 9 |
                    (uint)(auVar32[0] & 1) << 10 | (uint)(auVar36[0] & 1) << 0xb |
                    (uint)(auVar40[0] & 1) << 0xc | (uint)(auVar44[0] & 1) << 0xd |
                    (uint)(auVar48[0] & 1) << 0xe | (uint)auVar52[0] << 0xf |
                    (uint)(auVar56[0] & 1) << 0x10 | (uint)(auVar60[0] & 1) << 0x11 |
                    (uint)(auVar64[0] & 1) << 0x12 | (uint)(auVar68[0] & 1) << 0x13 |
                    (uint)(auVar72[0] & 1) << 0x14 | (uint)(auVar76[0] & 1) << 0x15 |
                    (uint)(auVar80[0] & 1) << 0x16 | (uint)auVar84[0] << 0x17 |
                    (uint)(auVar88[0] & 1) << 0x18 | (uint)(auVar92[0] & 1) << 0x19 |
                    (uint)(auVar96[0] & 1) << 0x1a | (uint)(auVar100[0] & 1) << 0x1b |
                    (uint)(auVar104[0] & 1) << 0x1c | (uint)(auVar108[0] & 1) << 0x1d |
                    (uint)(auVar112[0] & 1) << 0x1e | (uint)(bVar501 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar516 + 0x1c);
    }
  }
  while (uVar1 = uVar517 + 2, uVar1 <= uVar499) {
    lVar516 = 0x20;
    auVar523 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10),auVar518,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10));
    auVar526 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar517 * 0x10 + 0x10),auVar519,
                                 *(undefined1 (*) [32])(array + uVar517 * 0x10));
    for (; uVar517 = uVar1, lVar516 != 0; lVar516 = lVar516 + -4) {
      auVar527 = auVar523 >> 7;
      auVar529 = auVar523 >> 0xf;
      auVar524 = auVar523 >> 0x17;
      auVar530 = auVar523 >> 0x1f;
      auVar531 = auVar523 >> 0x27;
      auVar532 = auVar523 >> 0x2f;
      auVar533 = auVar523 >> 0x37;
      auVar534 = auVar523 >> 0x3f;
      auVar535 = auVar523 >> 0x47;
      auVar520 = auVar523 >> 0x4f;
      auVar525 = auVar523 >> 0x57;
      auVar528 = auVar523 >> 0x5f;
      auVar536 = auVar523 >> 0x67;
      auVar521 = auVar523 >> 0x6f;
      auVar522 = auVar523 >> 0x77;
      auVar4 = auVar523 >> 0x7f;
      auVar5 = auVar523 >> 0x87;
      auVar6 = auVar523 >> 0x8f;
      auVar7 = auVar523 >> 0x97;
      auVar8 = auVar523 >> 0x9f;
      auVar9 = auVar523 >> 0xa7;
      auVar10 = auVar523 >> 0xaf;
      auVar11 = auVar523 >> 0xb7;
      auVar12 = auVar523 >> 0xbf;
      auVar13 = auVar523 >> 199;
      auVar14 = auVar523 >> 0xcf;
      auVar15 = auVar523 >> 0xd7;
      auVar16 = auVar523 >> 0xdf;
      auVar17 = auVar523 >> 0xe7;
      auVar18 = auVar523 >> 0xef;
      auVar19 = auVar523 >> 0xf7;
      bVar500 = auVar523[0x1f];
      auVar523 = vpaddb_avx2(auVar523,auVar523);
      piVar2 = (int *)((long)flags + lVar516 + -4);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar527[0] & 1) | (uint)(auVar529[0] & 1) << 1 |
                                   (uint)(auVar524[0] & 1) << 2 | (uint)(auVar530[0] & 1) << 3 |
                                   (uint)(auVar531[0] & 1) << 4 | (uint)(auVar532[0] & 1) << 5 |
                                   (uint)(auVar533[0] & 1) << 6 | (uint)(auVar534[0] & 1) << 7 |
                                   (uint)(auVar535[0] & 1) << 8 | (uint)(auVar520[0] & 1) << 9 |
                                   (uint)(auVar525[0] & 1) << 10 | (uint)(auVar528[0] & 1) << 0xb |
                                   (uint)(auVar536[0] & 1) << 0xc | (uint)(auVar521[0] & 1) << 0xd |
                                   (uint)(auVar522[0] & 1) << 0xe | (uint)auVar4[0] << 0xf |
                                   (uint)(auVar5[0] & 1) << 0x10 | (uint)(auVar6[0] & 1) << 0x11 |
                                   (uint)(auVar7[0] & 1) << 0x12 | (uint)(auVar8[0] & 1) << 0x13 |
                                   (uint)(auVar9[0] & 1) << 0x14 | (uint)(auVar10[0] & 1) << 0x15 |
                                   (uint)(auVar11[0] & 1) << 0x16 | (uint)auVar12[0] << 0x17 |
                                   (uint)(auVar13[0] & 1) << 0x18 | (uint)(auVar14[0] & 1) << 0x19 |
                                   (uint)(auVar15[0] & 1) << 0x1a | (uint)(auVar16[0] & 1) << 0x1b |
                                   (uint)(auVar17[0] & 1) << 0x1c | (uint)(auVar18[0] & 1) << 0x1d |
                                   (uint)(auVar19[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f);
      auVar527 = auVar526 >> 7;
      auVar529 = auVar526 >> 0xf;
      auVar524 = auVar526 >> 0x17;
      auVar530 = auVar526 >> 0x1f;
      auVar531 = auVar526 >> 0x27;
      auVar532 = auVar526 >> 0x2f;
      auVar533 = auVar526 >> 0x37;
      auVar534 = auVar526 >> 0x3f;
      auVar535 = auVar526 >> 0x47;
      auVar520 = auVar526 >> 0x4f;
      auVar525 = auVar526 >> 0x57;
      auVar528 = auVar526 >> 0x5f;
      auVar536 = auVar526 >> 0x67;
      auVar521 = auVar526 >> 0x6f;
      auVar522 = auVar526 >> 0x77;
      auVar4 = auVar526 >> 0x7f;
      auVar5 = auVar526 >> 0x87;
      auVar6 = auVar526 >> 0x8f;
      auVar7 = auVar526 >> 0x97;
      auVar8 = auVar526 >> 0x9f;
      auVar9 = auVar526 >> 0xa7;
      auVar10 = auVar526 >> 0xaf;
      auVar11 = auVar526 >> 0xb7;
      auVar12 = auVar526 >> 0xbf;
      auVar13 = auVar526 >> 199;
      auVar14 = auVar526 >> 0xcf;
      auVar15 = auVar526 >> 0xd7;
      auVar16 = auVar526 >> 0xdf;
      auVar17 = auVar526 >> 0xe7;
      auVar18 = auVar526 >> 0xef;
      auVar19 = auVar526 >> 0xf7;
      bVar500 = auVar526[0x1f];
      auVar526 = vpaddb_avx2(auVar526,auVar526);
      piVar2 = (int *)((long)flags + lVar516 + 0x1c);
      *piVar2 = *piVar2 + POPCOUNT((uint)(auVar527[0] & 1) | (uint)(auVar529[0] & 1) << 1 |
                                   (uint)(auVar524[0] & 1) << 2 | (uint)(auVar530[0] & 1) << 3 |
                                   (uint)(auVar531[0] & 1) << 4 | (uint)(auVar532[0] & 1) << 5 |
                                   (uint)(auVar533[0] & 1) << 6 | (uint)(auVar534[0] & 1) << 7 |
                                   (uint)(auVar535[0] & 1) << 8 | (uint)(auVar520[0] & 1) << 9 |
                                   (uint)(auVar525[0] & 1) << 10 | (uint)(auVar528[0] & 1) << 0xb |
                                   (uint)(auVar536[0] & 1) << 0xc | (uint)(auVar521[0] & 1) << 0xd |
                                   (uint)(auVar522[0] & 1) << 0xe | (uint)auVar4[0] << 0xf |
                                   (uint)(auVar5[0] & 1) << 0x10 | (uint)(auVar6[0] & 1) << 0x11 |
                                   (uint)(auVar7[0] & 1) << 0x12 | (uint)(auVar8[0] & 1) << 0x13 |
                                   (uint)(auVar9[0] & 1) << 0x14 | (uint)(auVar10[0] & 1) << 0x15 |
                                   (uint)(auVar11[0] & 1) << 0x16 | (uint)auVar12[0] << 0x17 |
                                   (uint)(auVar13[0] & 1) << 0x18 | (uint)(auVar14[0] & 1) << 0x19 |
                                   (uint)(auVar15[0] & 1) << 0x1a | (uint)(auVar16[0] & 1) << 0x1b |
                                   (uint)(auVar17[0] & 1) << 0x1c | (uint)(auVar18[0] & 1) << 0x1d |
                                   (uint)(auVar19[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f);
    }
  }
  for (uVar517 = uVar517 << 4; uVar517 < len; uVar517 = uVar517 + 1) {
    uVar3 = array[uVar517];
    for (lVar516 = 0; lVar516 != 0x10; lVar516 = lVar516 + 1) {
      flags[lVar516] = flags[lVar516] + (uint)((uVar3 >> ((uint)lVar516 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll16(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 16 <= n_cycles; i += 16) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
    U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
    U(8,9) U(10,11) U(12,13) U(14,15)

        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A( 2, 3) A( 4, 5) A( 6, 7)
            A(8,9) A(10,11) A(12,13) A(14,15)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P( 2, 3) P( 4, 5) P( 6, 7)
            P(8,9) P(10,11) P(12,13) P(14,15)
        }
    }

    for (/**/; i + 8 <= n_cycles; i += 8) {
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7) 
        U(0,1) U(2, 3) U(4, 5) U(6, 7)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3) A( 4, 5) A( 6, 7)
            P(0,1) P( 2, 3) P( 4, 5) P( 6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3)
            P(0,1) P( 2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
    
    return 0;
}